

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O1

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  double dVar1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  uint uVar6;
  Item *pIVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  int iVar10;
  pointer pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  long lVar13;
  undefined8 uVar14;
  double dVar15;
  uint *puVar16;
  undefined8 *puVar17;
  undefined4 *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  uint *puVar21;
  undefined4 *puVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  pointer pnVar24;
  char cVar25;
  long lVar26;
  long lVar27;
  long in_FS_OFFSET;
  bool bVar28;
  byte bVar29;
  Real a;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ax;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_53;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nne;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_free;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_free;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  undefined1 local_ec8 [16];
  undefined1 local_eb8 [16];
  undefined1 local_ea8 [16];
  undefined1 local_e98 [16];
  undefined1 local_e88 [16];
  undefined1 local_e78 [16];
  uint local_e68 [3];
  undefined3 uStack_e5b;
  int iStack_e58;
  bool bStack_e54;
  undefined8 local_e50;
  double local_e48;
  undefined8 uStack_e40;
  undefined1 local_e38 [32];
  undefined1 local_e18 [16];
  undefined1 local_e08 [16];
  undefined1 local_df8 [16];
  undefined1 local_de8 [16];
  undefined1 local_dd8 [13];
  undefined3 uStack_dcb;
  int iStack_dc8;
  bool bStack_dc4;
  undefined8 local_dc0;
  double local_db8;
  undefined8 uStack_db0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_da8;
  undefined8 uStack_da0;
  undefined1 local_d98 [16];
  undefined1 local_d88 [16];
  undefined1 local_d78 [16];
  undefined1 local_d68 [16];
  undefined1 local_d58 [16];
  undefined1 local_d48 [16];
  uint local_d38 [3];
  undefined3 uStack_d2b;
  int iStack_d28;
  bool bStack_d24;
  undefined8 local_d20;
  cpp_dec_float<200U,_int,_void> local_d18;
  undefined1 local_c98 [32];
  undefined1 local_c78 [16];
  undefined1 local_c68 [16];
  undefined1 local_c58 [16];
  undefined1 local_c48 [16];
  undefined1 local_c38 [13];
  undefined3 uStack_c2b;
  int iStack_c28;
  bool bStack_c24;
  undefined8 local_c20;
  undefined1 local_c18 [32];
  undefined1 local_bf8 [16];
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [16];
  undefined1 local_bb8 [13];
  undefined3 uStack_bab;
  int iStack_ba8;
  bool bStack_ba4;
  undefined8 local_ba0;
  undefined1 local_b98 [16];
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  uint local_b38 [3];
  undefined3 uStack_b2b;
  int iStack_b28;
  bool bStack_b24;
  undefined8 local_b20;
  cpp_dec_float<200U,_int,_void> local_b18;
  undefined1 local_a98 [32];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [13];
  undefined3 uStack_a2b;
  int iStack_a28;
  bool bStack_a24;
  undefined8 local_a20;
  double local_a18;
  undefined8 uStack_a10;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  uint local_9a8 [3];
  undefined3 uStack_99b;
  int iStack_998;
  bool bStack_994;
  undefined8 local_990;
  cpp_dec_float<200U,_int,_void> local_988;
  double local_908;
  undefined8 uStack_900;
  cpp_dec_float<200U,_int,_void> local_8f8;
  cpp_dec_float<200U,_int,_void> local_878;
  cpp_dec_float<200U,_int,_void> local_7f8;
  cpp_dec_float<200U,_int,_void> local_778;
  cpp_dec_float<200U,_int,_void> local_6f8;
  cpp_dec_float<200U,_int,_void> local_678;
  cpp_dec_float<200U,_int,_void> local_5f8;
  cpp_dec_float<200U,_int,_void> local_578;
  cpp_dec_float<200U,_int,_void> local_4f8;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined5 uStack_410;
  undefined3 uStack_40b;
  int iStack_408;
  byte bStack_404;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined5 uStack_390;
  undefined3 uStack_38b;
  int iStack_388;
  byte bStack_384;
  undefined8 local_380;
  cpp_dec_float<200U,_int,_void> local_378;
  cpp_dec_float<200U,_int,_void> local_2f8;
  undefined1 local_278 [32];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [13];
  undefined3 uStack_20b;
  undefined5 uStack_208;
  undefined8 local_200;
  undefined4 local_1f0 [28];
  undefined4 local_180 [28];
  undefined4 local_110 [28];
  undefined4 local_a0 [28];
  
  bVar29 = 0;
  a = Tolerances::epsilon((base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  local_200._0_4_ = cpp_dec_float_finite;
  local_200._4_4_ = 0x1c;
  local_278._0_16_ = (undefined1  [16])0x0;
  local_278._16_16_ = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  local_218 = SUB1613((undefined1  [16])0x0,0);
  uStack_20b = 0;
  uStack_208._0_4_ = 0;
  uStack_208._4_1_ = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_278,a);
  local_988.fpclass = cpp_dec_float_finite;
  local_988.prec_elem = 0x1c;
  local_988.data._M_elems[0] = 0;
  local_988.data._M_elems[1] = 0;
  local_988.data._M_elems[2] = 0;
  local_988.data._M_elems[3] = 0;
  local_988.data._M_elems[4] = 0;
  local_988.data._M_elems[5] = 0;
  local_988.data._M_elems[6] = 0;
  local_988.data._M_elems[7] = 0;
  local_988.data._M_elems[8] = 0;
  local_988.data._M_elems[9] = 0;
  local_988.data._M_elems[10] = 0;
  local_988.data._M_elems[0xb] = 0;
  local_988.data._M_elems[0xc] = 0;
  local_988.data._M_elems[0xd] = 0;
  local_988.data._M_elems[0xe] = 0;
  local_988.data._M_elems[0xf] = 0;
  local_988.data._M_elems[0x10] = 0;
  local_988.data._M_elems[0x11] = 0;
  local_988.data._M_elems[0x12] = 0;
  local_988.data._M_elems[0x13] = 0;
  local_988.data._M_elems[0x14] = 0;
  local_988.data._M_elems[0x15] = 0;
  local_988.data._M_elems[0x16] = 0;
  local_988.data._M_elems[0x17] = 0;
  local_988.data._M_elems[0x18] = 0;
  local_988.data._M_elems[0x19] = 0;
  local_988.data._M_elems._104_5_ = 0;
  local_988.data._M_elems[0x1b]._1_3_ = 0;
  local_988.exp = 0;
  local_988.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_988,1.0);
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_da8 = *(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    uStack_da0 = 0;
    local_e48 = -(double)local_da8;
    uStack_e40 = 0x8000000000000000;
    lVar26 = 0;
    lVar27 = 0;
    do {
      pnVar11 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_e50._0_4_ = cpp_dec_float_finite;
      local_e50._4_4_ = 0x1c;
      local_ec8 = (undefined1  [16])0x0;
      local_eb8 = (undefined1  [16])0x0;
      local_ea8 = (undefined1  [16])0x0;
      local_e98 = (undefined1  [16])0x0;
      local_e88 = (undefined1  [16])0x0;
      local_e78 = (undefined1  [16])0x0;
      local_e68[0] = 0;
      local_e68[1] = 0;
      stack0xfffffffffffff1a0 = 0;
      uStack_e5b = 0;
      iStack_e58 = 0;
      bStack_e54 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_ec8,(double)local_da8);
      if (((*(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x78) != 2) &&
          ((fpclass_type)local_e50 != cpp_dec_float_NaN)) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)
                              ((long)&(pnVar11->m_backend).data + lVar26),
                              (cpp_dec_float<200U,_int,_void> *)local_ec8), iVar10 < 0)) {
        pnVar11 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar18 = (undefined4 *)((long)&(pnVar11->m_backend).data + lVar26);
        puVar22 = local_a0;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar22 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        }
        iVar10 = *(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x70);
        bVar5 = *(byte *)((long)&(pnVar11->m_backend).data + lVar26 + 0x74);
        uVar14 = *(undefined8 *)((long)&(pnVar11->m_backend).data + lVar26 + 0x78);
        local_dc0._0_4_ = cpp_dec_float_finite;
        local_dc0._4_4_ = 0x1c;
        bStack_dc4 = false;
        iStack_dc8 = 0;
        puVar18 = local_a0;
        puVar22 = (undefined4 *)local_e38;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar22 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        }
        bStack_dc4 = (bool)bVar5;
        if ((bVar5 == 1) && (local_e38._0_4_ != 0 || (fpclass_type)uVar14 != cpp_dec_float_finite))
        {
          bStack_dc4 = false;
        }
        iStack_dc8 = iVar10;
        local_dc0 = uVar14;
        if ((((fpclass_type)uVar14 != cpp_dec_float_NaN) &&
            (bVar28 = local_988.fpclass != cpp_dec_float_NaN, bVar28)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_e38,&local_988), 0 < iVar10)
           ) {
          pnVar11 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar21 = (uint *)((long)&(pnVar11->m_backend).data + lVar26);
          uVar6 = *puVar21;
          puVar16 = puVar21 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar29 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
          }
          cVar25 = (char)puVar21[0x1d];
          uVar14._0_4_ = puVar21[0x1e];
          uVar14._4_4_ = puVar21[0x1f];
          if (cVar25 == '\x01') {
            cVar25 = (fpclass_type)uVar14 == cpp_dec_float_finite && uVar6 == 0;
          }
          iVar10 = *(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x70);
          local_988.data._M_elems[0] = uVar6;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          puVar21 = local_988.data._M_elems + 1;
          for (lVar13 = 0x1b; local_988.exp = iVar10, local_988.neg = (bool)cVar25,
              local_988._120_8_ = uVar14, lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
        }
      }
      pnVar11 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_e50._0_4_ = cpp_dec_float_finite;
      local_e50._4_4_ = 0x1c;
      local_ec8 = (undefined1  [16])0x0;
      local_eb8 = (undefined1  [16])0x0;
      local_ea8 = (undefined1  [16])0x0;
      local_e98 = (undefined1  [16])0x0;
      local_e88 = (undefined1  [16])0x0;
      local_e78 = (undefined1  [16])0x0;
      local_e68[0] = 0;
      local_e68[1] = 0;
      stack0xfffffffffffff1a0 = 0;
      uStack_e5b = 0;
      iStack_e58 = 0;
      bStack_e54 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_ec8,local_e48);
      if (((*(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x78) != 2) &&
          ((fpclass_type)local_e50 != cpp_dec_float_NaN)) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)
                              ((long)&(pnVar11->m_backend).data + lVar26),
                              (cpp_dec_float<200U,_int,_void> *)local_ec8), 0 < iVar10)) {
        pnVar11 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar18 = (undefined4 *)((long)&(pnVar11->m_backend).data + lVar26);
        puVar22 = local_110;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar22 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        }
        iVar10 = *(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x70);
        bVar5 = *(byte *)((long)&(pnVar11->m_backend).data + lVar26 + 0x74);
        uVar14 = *(undefined8 *)((long)&(pnVar11->m_backend).data + lVar26 + 0x78);
        local_dc0._0_4_ = cpp_dec_float_finite;
        local_dc0._4_4_ = 0x1c;
        bStack_dc4 = false;
        iStack_dc8 = 0;
        puVar18 = local_110;
        puVar22 = (undefined4 *)local_e38;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar22 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        }
        bStack_dc4 = (bool)bVar5;
        if ((bVar5 == 1) && (local_e38._0_4_ != 0 || (fpclass_type)uVar14 != cpp_dec_float_finite))
        {
          bStack_dc4 = false;
        }
        iStack_dc8 = iVar10;
        local_dc0 = uVar14;
        if ((((fpclass_type)uVar14 != cpp_dec_float_NaN) &&
            (bVar28 = local_988.fpclass != cpp_dec_float_NaN, bVar28)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_e38,&local_988), 0 < iVar10)
           ) {
          pnVar11 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar21 = (uint *)((long)&(pnVar11->m_backend).data + lVar26);
          uVar6 = *puVar21;
          puVar16 = puVar21 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar29 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
          }
          cVar25 = (char)puVar21[0x1d];
          uVar2._0_4_ = puVar21[0x1e];
          uVar2._4_4_ = puVar21[0x1f];
          if (cVar25 == '\x01') {
            cVar25 = (fpclass_type)uVar2 == cpp_dec_float_finite && uVar6 == 0;
          }
          iVar10 = *(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x70);
          local_988.data._M_elems[0] = uVar6;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          puVar21 = local_988.data._M_elems + 1;
          for (lVar13 = 0x1b; local_988.exp = iVar10, local_988.neg = (bool)cVar25,
              local_988._120_8_ = uVar2, lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
        }
      }
      lVar27 = lVar27 + 1;
      lVar26 = lVar26 + 0x80;
    } while (lVar27 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_da8 = *(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    uStack_da0 = 0;
    local_e48 = -(double)local_da8;
    uStack_e40 = 0x8000000000000000;
    lVar26 = 0;
    lVar27 = 0;
    do {
      pnVar11 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_e50._0_4_ = cpp_dec_float_finite;
      local_e50._4_4_ = 0x1c;
      local_ec8 = (undefined1  [16])0x0;
      local_eb8 = (undefined1  [16])0x0;
      local_ea8 = (undefined1  [16])0x0;
      local_e98 = (undefined1  [16])0x0;
      local_e88 = (undefined1  [16])0x0;
      local_e78 = (undefined1  [16])0x0;
      local_e68[0] = 0;
      local_e68[1] = 0;
      stack0xfffffffffffff1a0 = 0;
      uStack_e5b = 0;
      iStack_e58 = 0;
      bStack_e54 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_ec8,(double)local_da8);
      if (((*(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x78) != 2) &&
          ((fpclass_type)local_e50 != cpp_dec_float_NaN)) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)
                              ((long)&(pnVar11->m_backend).data + lVar26),
                              (cpp_dec_float<200U,_int,_void> *)local_ec8), iVar10 < 0)) {
        pnVar11 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar18 = (undefined4 *)((long)&(pnVar11->m_backend).data + lVar26);
        puVar22 = local_180;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar22 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        }
        iVar10 = *(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x70);
        bVar5 = *(byte *)((long)&(pnVar11->m_backend).data + lVar26 + 0x74);
        uVar14 = *(undefined8 *)((long)&(pnVar11->m_backend).data + lVar26 + 0x78);
        local_dc0._0_4_ = cpp_dec_float_finite;
        local_dc0._4_4_ = 0x1c;
        bStack_dc4 = false;
        iStack_dc8 = 0;
        puVar18 = local_180;
        puVar22 = (undefined4 *)local_e38;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar22 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        }
        bStack_dc4 = (bool)bVar5;
        if ((bVar5 == 1) && (local_e38._0_4_ != 0 || (fpclass_type)uVar14 != cpp_dec_float_finite))
        {
          bStack_dc4 = false;
        }
        iStack_dc8 = iVar10;
        local_dc0 = uVar14;
        if ((((fpclass_type)uVar14 != cpp_dec_float_NaN) &&
            (bVar28 = local_988.fpclass != cpp_dec_float_NaN, bVar28)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_e38,&local_988), 0 < iVar10)
           ) {
          pnVar11 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar21 = (uint *)((long)&(pnVar11->m_backend).data + lVar26);
          uVar6 = *puVar21;
          puVar16 = puVar21 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar29 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
          }
          cVar25 = (char)puVar21[0x1d];
          uVar4._0_4_ = puVar21[0x1e];
          uVar4._4_4_ = puVar21[0x1f];
          if (cVar25 == '\x01') {
            cVar25 = (fpclass_type)uVar4 == cpp_dec_float_finite && uVar6 == 0;
          }
          iVar10 = *(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x70);
          local_988.data._M_elems[0] = uVar6;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          puVar21 = local_988.data._M_elems + 1;
          for (lVar13 = 0x1b; local_988.exp = iVar10, local_988.neg = (bool)cVar25,
              local_988._120_8_ = uVar4, lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
        }
      }
      pnVar11 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_e50._0_4_ = cpp_dec_float_finite;
      local_e50._4_4_ = 0x1c;
      local_ec8 = (undefined1  [16])0x0;
      local_eb8 = (undefined1  [16])0x0;
      local_ea8 = (undefined1  [16])0x0;
      local_e98 = (undefined1  [16])0x0;
      local_e88 = (undefined1  [16])0x0;
      local_e78 = (undefined1  [16])0x0;
      local_e68[0] = 0;
      local_e68[1] = 0;
      stack0xfffffffffffff1a0 = 0;
      uStack_e5b = 0;
      iStack_e58 = 0;
      bStack_e54 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_ec8,local_e48);
      if (((*(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x78) != 2) &&
          ((fpclass_type)local_e50 != cpp_dec_float_NaN)) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)
                              ((long)&(pnVar11->m_backend).data + lVar26),
                              (cpp_dec_float<200U,_int,_void> *)local_ec8), 0 < iVar10)) {
        pnVar11 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar18 = (undefined4 *)((long)&(pnVar11->m_backend).data + lVar26);
        puVar22 = local_1f0;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar22 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        }
        iVar10 = *(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x70);
        bVar5 = *(byte *)((long)&(pnVar11->m_backend).data + lVar26 + 0x74);
        uVar14 = *(undefined8 *)((long)&(pnVar11->m_backend).data + lVar26 + 0x78);
        local_dc0._0_4_ = cpp_dec_float_finite;
        local_dc0._4_4_ = 0x1c;
        bStack_dc4 = false;
        iStack_dc8 = 0;
        puVar18 = local_1f0;
        puVar22 = (undefined4 *)local_e38;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar22 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
          puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
        }
        bStack_dc4 = (bool)bVar5;
        if ((bVar5 == 1) && (local_e38._0_4_ != 0 || (fpclass_type)uVar14 != cpp_dec_float_finite))
        {
          bStack_dc4 = false;
        }
        iStack_dc8 = iVar10;
        local_dc0 = uVar14;
        if ((((fpclass_type)uVar14 != cpp_dec_float_NaN) &&
            (bVar28 = local_988.fpclass != cpp_dec_float_NaN, bVar28)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_e38,&local_988), 0 < iVar10)
           ) {
          pnVar11 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar21 = (uint *)((long)&(pnVar11->m_backend).data + lVar26);
          uVar6 = *puVar21;
          puVar16 = puVar21 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar29 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
          }
          cVar25 = (char)puVar21[0x1d];
          uVar3._0_4_ = puVar21[0x1e];
          uVar3._4_4_ = puVar21[0x1f];
          if (cVar25 == '\x01') {
            cVar25 = (fpclass_type)uVar3 == cpp_dec_float_finite && uVar6 == 0;
          }
          iVar10 = *(int *)((long)&(pnVar11->m_backend).data + lVar26 + 0x70);
          local_988.data._M_elems[0] = uVar6;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          puVar21 = local_988.data._M_elems + 1;
          for (lVar13 = 0x1b; local_988.exp = iVar10, local_988.neg = (bool)cVar25,
              local_988._120_8_ = uVar3, lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
        }
      }
      lVar27 = lVar27 + 1;
      lVar26 = lVar26 + 0x80;
    } while (lVar27 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  this_00 = &(base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object;
  if (base->theType * base->theRep < 1) {
    local_da8 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)this_00;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_e38,this_00);
    local_990._0_4_ = cpp_dec_float_finite;
    local_990._4_4_ = 0x1c;
    local_a08 = (undefined1  [16])0x0;
    local_9f8 = (undefined1  [16])0x0;
    local_9e8 = (undefined1  [16])0x0;
    local_9d8 = (undefined1  [16])0x0;
    local_9c8 = (undefined1  [16])0x0;
    local_9b8 = (undefined1  [16])0x0;
    local_9a8[0] = 0;
    local_9a8[1] = 0;
    stack0xfffffffffffff660 = 0;
    uStack_99b = 0;
    iStack_998 = 0;
    bStack_994 = false;
    local_e50._0_4_ = cpp_dec_float_finite;
    local_e50._4_4_ = 0x1c;
    local_ec8 = (undefined1  [16])0x0;
    local_eb8 = (undefined1  [16])0x0;
    local_ea8 = (undefined1  [16])0x0;
    local_e98 = (undefined1  [16])0x0;
    local_e88 = (undefined1  [16])0x0;
    local_e78 = (undefined1  [16])0x0;
    local_e68[0] = 0;
    local_e68[1] = 0;
    stack0xfffffffffffff1a0 = 0;
    uStack_e5b = 0;
    iStack_e58 = 0;
    bStack_e54 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_ec8,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_a08,
               (cpp_dec_float<200U,_int,_void> *)local_ec8,
               (cpp_dec_float<200U,_int,_void> *)local_e38);
    local_8f8.fpclass = cpp_dec_float_finite;
    local_8f8.prec_elem = 0x1c;
    local_8f8.data._M_elems[0] = 0;
    local_8f8.data._M_elems[1] = 0;
    local_8f8.data._M_elems[2] = 0;
    local_8f8.data._M_elems[3] = 0;
    local_8f8.data._M_elems[4] = 0;
    local_8f8.data._M_elems[5] = 0;
    local_8f8.data._M_elems[6] = 0;
    local_8f8.data._M_elems[7] = 0;
    local_8f8.data._M_elems[8] = 0;
    local_8f8.data._M_elems[9] = 0;
    local_8f8.data._M_elems[10] = 0;
    local_8f8.data._M_elems[0xb] = 0;
    local_8f8.data._M_elems[0xc] = 0;
    local_8f8.data._M_elems[0xd] = 0;
    local_8f8.data._M_elems[0xe] = 0;
    local_8f8.data._M_elems[0xf] = 0;
    local_8f8.data._M_elems[0x10] = 0;
    local_8f8.data._M_elems[0x11] = 0;
    local_8f8.data._M_elems[0x12] = 0;
    local_8f8.data._M_elems[0x13] = 0;
    local_8f8.data._M_elems[0x14] = 0;
    local_8f8.data._M_elems[0x15] = 0;
    local_8f8.data._M_elems[0x16] = 0;
    local_8f8.data._M_elems[0x17] = 0;
    local_8f8.data._M_elems[0x18] = 0;
    local_8f8.data._M_elems[0x19] = 0;
    local_8f8.data._M_elems._104_5_ = 0;
    local_8f8.data._M_elems[0x1b]._1_3_ = 0;
    local_8f8.exp = 0;
    local_8f8.neg = false;
    local_e50._0_4_ = cpp_dec_float_finite;
    local_e50._4_4_ = 0x1c;
    local_ec8 = ZEXT816(0);
    local_eb8 = ZEXT816(0);
    local_ea8 = ZEXT816(0);
    local_e98 = ZEXT816(0);
    local_e88 = ZEXT816(0);
    local_e78 = ZEXT816(0);
    local_e68[0] = 0;
    local_e68[1] = 0;
    stack0xfffffffffffff1a0 = 0;
    uStack_e5b = 0;
    iStack_e58 = 0;
    bStack_e54 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_ec8,0.01);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_8f8,(cpp_dec_float<200U,_int,_void> *)local_ec8,&local_988);
    local_2f8.fpclass = cpp_dec_float_finite;
    local_2f8.prec_elem = 0x1c;
    local_2f8.data._M_elems[0] = 0;
    local_2f8.data._M_elems[1] = 0;
    local_2f8.data._M_elems[2] = 0;
    local_2f8.data._M_elems[3] = 0;
    local_2f8.data._M_elems[4] = 0;
    local_2f8.data._M_elems[5] = 0;
    local_2f8.data._M_elems[6] = 0;
    local_2f8.data._M_elems[7] = 0;
    local_2f8.data._M_elems[8] = 0;
    local_2f8.data._M_elems[9] = 0;
    local_2f8.data._M_elems[10] = 0;
    local_2f8.data._M_elems[0xb] = 0;
    local_2f8.data._M_elems[0xc] = 0;
    local_2f8.data._M_elems[0xd] = 0;
    local_2f8.data._M_elems[0xe] = 0;
    local_2f8.data._M_elems[0xf] = 0;
    local_2f8.data._M_elems[0x10] = 0;
    local_2f8.data._M_elems[0x11] = 0;
    local_2f8.data._M_elems[0x12] = 0;
    local_2f8.data._M_elems[0x13] = 0;
    local_2f8.data._M_elems[0x14] = 0;
    local_2f8.data._M_elems[0x15] = 0;
    local_2f8.data._M_elems[0x16] = 0;
    local_2f8.data._M_elems[0x17] = 0;
    local_2f8.data._M_elems[0x18] = 0;
    local_2f8.data._M_elems[0x19] = 0;
    local_2f8.data._M_elems._104_5_ = 0;
    local_2f8.data._M_elems[0x1b]._1_3_ = 0;
    local_2f8.exp = 0;
    local_2f8.neg = false;
    local_e50._0_4_ = cpp_dec_float_finite;
    local_e50._4_4_ = 0x1c;
    local_ec8 = ZEXT816(0);
    local_eb8 = ZEXT816(0);
    local_ea8 = ZEXT816(0);
    local_e98 = ZEXT816(0);
    local_e88 = ZEXT816(0);
    local_e78 = ZEXT816(0);
    local_e68[0] = 0;
    local_e68[1] = 0;
    stack0xfffffffffffff1a0 = 0;
    uStack_e5b = 0;
    iStack_e58 = 0;
    bStack_e54 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_ec8,0.0001);
    pcVar12 = &local_8f8;
    pcVar19 = &local_2f8;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
      pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
    }
    local_2f8.exp = local_8f8.exp;
    local_2f8.neg = local_8f8.neg;
    local_2f8.fpclass = local_8f8.fpclass;
    local_2f8.prec_elem = local_8f8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&local_2f8,(cpp_dec_float<200U,_int,_void> *)local_ec8);
    local_378.fpclass = cpp_dec_float_finite;
    local_378.prec_elem = 0x1c;
    local_378.data._M_elems[0] = 0;
    local_378.data._M_elems[1] = 0;
    local_378.data._M_elems[2] = 0;
    local_378.data._M_elems[3] = 0;
    local_378.data._M_elems[4] = 0;
    local_378.data._M_elems[5] = 0;
    local_378.data._M_elems[6] = 0;
    local_378.data._M_elems[7] = 0;
    local_378.data._M_elems[8] = 0;
    local_378.data._M_elems[9] = 0;
    local_378.data._M_elems[10] = 0;
    local_378.data._M_elems[0xb] = 0;
    local_378.data._M_elems[0xc] = 0;
    local_378.data._M_elems[0xd] = 0;
    local_378.data._M_elems[0xe] = 0;
    local_378.data._M_elems[0xf] = 0;
    local_378.data._M_elems[0x10] = 0;
    local_378.data._M_elems[0x11] = 0;
    local_378.data._M_elems[0x12] = 0;
    local_378.data._M_elems[0x13] = 0;
    local_378.data._M_elems[0x14] = 0;
    local_378.data._M_elems[0x15] = 0;
    local_378.data._M_elems[0x16] = 0;
    local_378.data._M_elems[0x17] = 0;
    local_378.data._M_elems[0x18] = 0;
    local_378.data._M_elems[0x19] = 0;
    local_378.data._M_elems._104_5_ = 0;
    local_378.data._M_elems[0x1b]._1_3_ = 0;
    local_378.exp = 0;
    local_378.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_378,100000.0);
    local_380._0_4_ = cpp_dec_float_finite;
    local_380._4_4_ = 0x1c;
    local_3f8 = 0;
    uStack_3f0 = 0;
    local_3e8 = 0;
    uStack_3e0 = 0;
    local_3d8 = 0;
    uStack_3d0 = 0;
    local_3c8 = 0;
    uStack_3c0 = 0;
    local_3b8 = 0;
    uStack_3b0 = 0;
    local_3a8 = 0;
    uStack_3a0 = 0;
    local_398 = 0;
    uStack_390 = 0;
    uStack_38b = 0;
    iStack_388 = 0;
    bStack_384 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3f8,10000.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_4f8,1,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_678,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_5f8,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_578,0,(type *)0x0);
    local_400._0_4_ = cpp_dec_float_finite;
    local_400._4_4_ = 0x1c;
    local_478 = 0;
    uStack_470 = 0;
    local_468 = 0;
    uStack_460 = 0;
    local_458 = 0;
    uStack_450 = 0;
    local_448 = 0;
    uStack_440 = 0;
    local_438 = 0;
    uStack_430 = 0;
    local_428 = 0;
    uStack_420 = 0;
    local_418 = 0;
    uStack_410 = 0;
    uStack_40b = 0;
    iStack_408 = 0;
    bStack_404 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_478,-10000.0);
    local_b20._0_4_ = cpp_dec_float_finite;
    local_b20._4_4_ = 0x1c;
    local_b98 = ZEXT816(0);
    local_b88 = ZEXT816(0);
    local_b78 = ZEXT816(0);
    local_b68 = ZEXT816(0);
    local_b58 = ZEXT816(0);
    local_b48 = ZEXT816(0);
    local_b38[0] = 0;
    local_b38[1] = 0;
    stack0xfffffffffffff4d0 = 0;
    uStack_b2b = 0;
    iStack_b28 = 0;
    bStack_b24 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_b98,-100000.0);
    lVar26 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar26) {
      local_db8 = *(double *)(in_FS_OFFSET + -8);
      uStack_db0 = 0;
      local_a18 = -local_db8;
      uStack_a10 = 0x8000000000000000;
      dVar15 = (double)(lVar26 + 1);
      lVar26 = lVar26 << 7;
      do {
        local_dc0._0_4_ = cpp_dec_float_finite;
        local_dc0._4_4_ = 0x1c;
        local_e38._0_16_ = (undefined1  [16])0x0;
        local_e38._16_16_ = (undefined1  [16])0x0;
        local_e18 = (undefined1  [16])0x0;
        local_e08 = (undefined1  [16])0x0;
        local_df8 = (undefined1  [16])0x0;
        local_de8 = (undefined1  [16])0x0;
        local_dd8 = SUB1613((undefined1  [16])0x0,0);
        uStack_dcb = 0;
        iStack_dc8 = 0;
        bStack_dc4 = false;
        local_e48 = dVar15;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                   (long)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[(long)dVar15 - 2].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused + -1,(type *)0x0);
        pcVar12 = &local_2f8;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_e38;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
        }
        iStack_dc8 = local_2f8.exp;
        bStack_dc4 = local_2f8.neg;
        local_dc0._0_4_ = local_2f8.fpclass;
        local_dc0._4_4_ = local_2f8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_e38,
                   (cpp_dec_float<200U,_int,_void> *)local_ec8);
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
        local_ba0._0_4_ = cpp_dec_float_finite;
        local_ba0._4_4_ = 0x1c;
        local_c18._0_16_ = (undefined1  [16])0x0;
        local_c18._16_16_ = (undefined1  [16])0x0;
        local_bf8 = (undefined1  [16])0x0;
        local_be8 = (undefined1  [16])0x0;
        local_bd8 = (undefined1  [16])0x0;
        local_bc8 = (undefined1  [16])0x0;
        local_bb8 = SUB1613((undefined1  [16])0x0,0);
        uStack_bab = 0;
        iStack_ba8 = 0;
        bStack_ba4 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a08;
        if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_c18) {
          puVar21 = (uint *)local_c18;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
          iStack_ba8 = iStack_998;
          bStack_ba4 = bStack_994;
          local_ba0._0_4_ = (fpclass_type)local_990;
          local_ba0._4_4_ = local_990._4_4_;
          pcVar12 = pcVar19;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_c18,pcVar12);
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
        local_a20._0_4_ = cpp_dec_float_finite;
        local_a20._4_4_ = 0x1c;
        local_a98._0_16_ = (undefined1  [16])0x0;
        local_a98._16_16_ = (undefined1  [16])0x0;
        local_a78 = (undefined1  [16])0x0;
        local_a68 = (undefined1  [16])0x0;
        local_a58 = (undefined1  [16])0x0;
        local_a48 = (undefined1  [16])0x0;
        local_a38 = SUB1613((undefined1  [16])0x0,0);
        uStack_a2b = 0;
        iStack_a28 = 0;
        bStack_a24 = false;
        pcVar12 = &local_8f8;
        if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_a98) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_a98;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
          }
          iStack_a28 = local_8f8.exp;
          bStack_a24 = local_8f8.neg;
          local_a20._0_4_ = local_8f8.fpclass;
          local_a20._4_4_ = local_8f8.prec_elem;
          pcVar12 = pcVar19;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_a98,pcVar12);
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
        local_d20._0_4_ = cpp_dec_float_finite;
        local_d20._4_4_ = 0x1c;
        local_d98 = (undefined1  [16])0x0;
        local_d88 = (undefined1  [16])0x0;
        local_d78 = (undefined1  [16])0x0;
        local_d68 = (undefined1  [16])0x0;
        local_d58 = (undefined1  [16])0x0;
        local_d48 = (undefined1  [16])0x0;
        local_d38[0] = 0;
        local_d38[1] = 0;
        stack0xfffffffffffff2d0 = 0;
        uStack_d2b = 0;
        iStack_d28 = 0;
        bStack_d24 = false;
        pcVar12 = &local_8f8;
        if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_d98) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_d98;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
          }
          iStack_d28 = local_8f8.exp;
          bStack_d24 = local_8f8.neg;
          local_d20._0_4_ = local_8f8.fpclass;
          local_d20._4_4_ = local_8f8.prec_elem;
          pcVar12 = pcVar19;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_d98,pcVar12);
        pnVar11 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_e50._0_4_ = cpp_dec_float_finite;
        local_e50._4_4_ = 0x1c;
        local_ec8 = (undefined1  [16])0x0;
        local_eb8 = (undefined1  [16])0x0;
        local_ea8 = (undefined1  [16])0x0;
        local_e98 = (undefined1  [16])0x0;
        local_e88 = (undefined1  [16])0x0;
        local_e78 = (undefined1  [16])0x0;
        local_e68[0] = 0;
        local_e68[1] = 0;
        stack0xfffffffffffff1a0 = 0;
        uStack_e5b = 0;
        iStack_e58 = 0;
        bStack_e54 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_ec8,local_db8);
        if (((*(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) == 2) ||
            ((fpclass_type)local_e50 == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)&pnVar11[-1].m_backend.data + lVar26),
                                (cpp_dec_float<200U,_int,_void> *)local_ec8), -1 < iVar10)) {
          pnVar11 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_e50._0_4_ = cpp_dec_float_finite;
          local_e50._4_4_ = 0x1c;
          local_ec8 = ZEXT816(0);
          local_eb8 = ZEXT816(0);
          local_ea8 = ZEXT816(0);
          local_e98 = ZEXT816(0);
          local_e88 = ZEXT816(0);
          local_e78 = ZEXT816(0);
          local_e68[0] = 0;
          local_e68[1] = 0;
          stack0xfffffffffffff1a0 = 0;
          uStack_e5b = 0;
          iStack_e58 = 0;
          bStack_e54 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_ec8,local_a18);
          if (((*(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) == 2) ||
              ((fpclass_type)local_e50 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)&pnVar11[-1].m_backend.data + lVar26),
                                  (cpp_dec_float<200U,_int,_void> *)local_ec8), iVar10 < 1)) {
            local_c20._0_4_ = cpp_dec_float_finite;
            local_c20._4_4_ = 0x1c;
            bStack_c24 = false;
            iStack_c28 = 0;
            puVar21 = (uint *)&local_478;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c98;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            }
            iStack_c28 = iStack_408;
            bStack_c24 = (bool)bStack_404;
            local_c20._0_4_ = (fpclass_type)local_400;
            local_c20._4_4_ = local_400._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_c98,
                       (cpp_dec_float<200U,_int,_void> *)local_e38);
            puVar21 = (uint *)local_c18;
            pcVar12 = &local_d18;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_d18.exp = iStack_ba8;
            local_d18.neg = bStack_ba4;
            local_d18.fpclass = (fpclass_type)local_ba0;
            local_d18.prec_elem = local_ba0._4_4_;
            if ((bStack_ba4 == true) &&
               ((fpclass_type)local_ba0 != cpp_dec_float_finite || local_d18.data._M_elems[0] != 0))
            {
              local_d18.neg = false;
            }
            local_e50._0_4_ = cpp_dec_float_finite;
            local_e50._4_4_ = 0x1c;
            bStack_e54 = false;
            iStack_e58 = 0;
            puVar21 = (uint *)local_c98;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            }
            iStack_e58 = iStack_c28;
            bStack_e54 = bStack_c24;
            local_e50._0_4_ = (fpclass_type)local_c20;
            local_e50._4_4_ = local_c20._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_ec8,&local_d18);
            goto LAB_005a2727;
          }
          local_d18.fpclass = cpp_dec_float_finite;
          local_d18.prec_elem = 0x1c;
          local_d18.neg = false;
          local_d18.exp = 0;
          pcVar12 = &local_5f8;
          pcVar19 = &local_d18;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
          }
          local_d18.exp = local_5f8.exp;
          local_d18.neg = local_5f8.neg;
          local_d18.fpclass = local_5f8.fpclass;
          local_d18.prec_elem = local_5f8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_c18);
          local_c20._0_4_ = cpp_dec_float_finite;
          local_c20._4_4_ = 0x1c;
LAB_005a249d:
          iStack_c28 = 0;
          bStack_c24 = false;
          pcVar12 = &local_d18;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c98;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
          }
          iStack_c28 = local_d18.exp;
          bStack_c24 = local_d18.neg;
          local_c20._0_4_ = local_d18.fpclass;
          local_c20._4_4_ = local_d18.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_c98,
                     (cpp_dec_float<200U,_int,_void> *)local_d98);
          local_e50._0_4_ = cpp_dec_float_finite;
          local_e50._4_4_ = 0x1c;
          iStack_e58 = 0;
          bStack_e54 = false;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c98;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
          }
          iStack_e58 = iStack_c28;
          bStack_e54 = bStack_c24;
          local_e50._0_4_ = (fpclass_type)local_c20;
          local_e50._4_4_ = local_c20._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                     (cpp_dec_float<200U,_int,_void> *)local_e38);
          pnVar11 = (this->colWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          puVar21 = (uint *)((long)&pnVar11[-1].m_backend.data + lVar26);
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
          *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_e58;
          *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_e54;
          *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_e50;
          (this->colUp).data[(long)local_e48 - 2] = false;
        }
        else {
          pnVar11 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar11[-1].m_backend.data + lVar26);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .up.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
          local_7f8.fpclass = cpp_dec_float_finite;
          local_7f8.prec_elem = 0x1c;
          local_7f8.data._M_elems[0] = 0;
          local_7f8.data._M_elems[1] = 0;
          local_7f8.data._M_elems[2] = 0;
          local_7f8.data._M_elems[3] = 0;
          local_7f8.data._M_elems[4] = 0;
          local_7f8.data._M_elems[5] = 0;
          local_7f8.data._M_elems[6] = 0;
          local_7f8.data._M_elems[7] = 0;
          local_7f8.data._M_elems[8] = 0;
          local_7f8.data._M_elems[9] = 0;
          local_7f8.data._M_elems[10] = 0;
          local_7f8.data._M_elems[0xb] = 0;
          local_7f8.data._M_elems[0xc] = 0;
          local_7f8.data._M_elems[0xd] = 0;
          local_7f8.data._M_elems[0xe] = 0;
          local_7f8.data._M_elems[0xf] = 0;
          local_7f8.data._M_elems[0x10] = 0;
          local_7f8.data._M_elems[0x11] = 0;
          local_7f8.data._M_elems[0x12] = 0;
          local_7f8.data._M_elems[0x13] = 0;
          local_7f8.data._M_elems[0x14] = 0;
          local_7f8.data._M_elems[0x15] = 0;
          local_7f8.data._M_elems[0x16] = 0;
          local_7f8.data._M_elems[0x17] = 0;
          local_7f8.data._M_elems[0x18] = 0;
          local_7f8.data._M_elems[0x19] = 0;
          local_7f8.data._M_elems._104_5_ = 0;
          local_7f8.data._M_elems[0x1b]._1_3_ = 0;
          local_7f8.exp = 0;
          local_7f8.neg = false;
          if (pcVar19 == &local_7f8) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_7f8,pcVar12);
            if (local_7f8.data._M_elems[0] != 0 || local_7f8.fpclass != cpp_dec_float_finite) {
              local_7f8.neg = (bool)(local_7f8.neg ^ 1);
            }
          }
          else {
            if (pcVar12 != &local_7f8) {
              pcVar20 = &local_7f8;
              for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_7f8.exp = *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70);
              local_7f8.neg = *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74);
              local_7f8._120_8_ = *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78)
              ;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_7f8,pcVar19);
          }
          local_e50._0_4_ = cpp_dec_float_finite;
          local_e50._4_4_ = 0x1c;
          bStack_e54 = false;
          iStack_e58 = 0;
          pcVar12 = &local_7f8;
          puVar21 = (uint *)local_ec8;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
          iStack_e58 = local_7f8.exp;
          bStack_e54 = local_7f8.neg;
          local_e50._0_4_ = local_7f8.fpclass;
          local_e50._4_4_ = local_7f8.prec_elem;
          if ((local_7f8.neg == true) &&
             (local_ec8._0_4_ != 0 || local_7f8.fpclass != cpp_dec_float_finite)) {
            bStack_e54 = false;
          }
          if (((local_7f8.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_200 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                                  (cpp_dec_float<200U,_int,_void> *)local_278), -1 < iVar10)) {
            pnVar11 = (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_e50._0_4_ = cpp_dec_float_finite;
            local_e50._4_4_ = 0x1c;
            local_ec8 = (undefined1  [16])0x0;
            local_eb8 = (undefined1  [16])0x0;
            local_ea8 = (undefined1  [16])0x0;
            local_e98 = (undefined1  [16])0x0;
            local_e88 = (undefined1  [16])0x0;
            local_e78 = (undefined1  [16])0x0;
            local_e68[0] = 0;
            local_e68[1] = 0;
            stack0xfffffffffffff1a0 = 0;
            uStack_e5b = 0;
            iStack_e58 = 0;
            bStack_e54 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_ec8,local_a18);
            if (((*(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) != 2) &&
                ((fpclass_type)local_e50 != cpp_dec_float_NaN)) &&
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)
                                    ((long)&pnVar11[-1].m_backend.data + lVar26),
                                    (cpp_dec_float<200U,_int,_void> *)local_ec8), 0 < iVar10)) {
              if ((fpclass_type)local_ba0 != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_ec8,0,(type *)0x0);
                iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_c18,
                                    (cpp_dec_float<200U,_int,_void> *)local_ec8);
                if (0 < iVar10) {
                  local_d18.fpclass = cpp_dec_float_finite;
                  local_d18.prec_elem = 0x1c;
                  local_d18.neg = false;
                  local_d18.exp = 0;
                  pcVar12 = &local_4f8;
                  pcVar19 = &local_d18;
                  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                    (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                  }
                  local_d18.exp = local_4f8.exp;
                  local_d18.neg = local_4f8.neg;
                  local_d18.fpclass = local_4f8.fpclass;
                  local_d18.prec_elem = local_4f8.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_c18);
                  local_c20._0_4_ = cpp_dec_float_finite;
                  local_c20._4_4_ = 0x1c;
                  iStack_c28 = 0;
                  bStack_c24 = false;
                  pcVar12 = &local_d18;
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c98;
                  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                    (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                  }
                  iStack_c28 = local_d18.exp;
                  bStack_c24 = local_d18.neg;
                  local_c20._0_4_ = local_d18.fpclass;
                  local_c20._4_4_ = local_d18.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_c98,
                             (cpp_dec_float<200U,_int,_void> *)local_a98);
                  goto LAB_005a2bb2;
                }
              }
              local_d18.fpclass = cpp_dec_float_finite;
              local_d18.prec_elem = 0x1c;
              local_d18.neg = false;
              local_d18.exp = 0;
              pcVar12 = &local_4f8;
              pcVar19 = &local_d18;
              for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_d18.exp = local_4f8.exp;
              local_d18.neg = local_4f8.neg;
              local_d18.fpclass = local_4f8.fpclass;
              local_d18.prec_elem = local_4f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_c18);
              local_c20._0_4_ = cpp_dec_float_finite;
              local_c20._4_4_ = 0x1c;
              goto LAB_005a249d;
            }
            local_d18.fpclass = cpp_dec_float_finite;
            local_d18.prec_elem = 0x1c;
            local_d18.neg = false;
            local_d18.exp = 0;
            pcVar12 = &local_5f8;
            pcVar19 = &local_d18;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            local_d18.exp = local_5f8.exp;
            local_d18.neg = local_5f8.neg;
            local_d18.fpclass = local_5f8.fpclass;
            local_d18.prec_elem = local_5f8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_a98);
            local_c20._0_4_ = cpp_dec_float_finite;
            local_c20._4_4_ = 0x1c;
            iStack_c28 = 0;
            bStack_c24 = false;
            pcVar12 = &local_d18;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c98;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_c28 = local_d18.exp;
            bStack_c24 = local_d18.neg;
            local_c20._0_4_ = local_d18.fpclass;
            local_c20._4_4_ = local_d18.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_c98,
                       (cpp_dec_float<200U,_int,_void> *)local_c18);
LAB_005a2bb2:
            local_e50._0_4_ = cpp_dec_float_finite;
            local_e50._4_4_ = 0x1c;
            iStack_e58 = 0;
            bStack_e54 = false;
            puVar21 = (uint *)local_c98;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            }
            iStack_e58 = iStack_c28;
            bStack_e54 = bStack_c24;
            local_e50._0_4_ = (fpclass_type)local_c20;
            local_e50._4_4_ = local_c20._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                       (cpp_dec_float<200U,_int,_void> *)local_e38);
            pnVar11 = (this->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            puVar21 = (uint *)((long)&pnVar11[-1].m_backend.data + lVar26);
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              *puVar21 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
            }
            *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_e58;
            *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_e54;
            *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_e50;
            (this->colUp).data[(long)local_e48 - 2] = true;
          }
          else {
            local_c20._0_4_ = cpp_dec_float_finite;
            local_c20._4_4_ = 0x1c;
            bStack_c24 = false;
            iStack_c28 = 0;
            pcVar12 = &local_378;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c98;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_c28 = local_378.exp;
            bStack_c24 = local_378.neg;
            local_c20._0_4_ = local_378.fpclass;
            local_c20._4_4_ = local_378.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_c98,
                       (cpp_dec_float<200U,_int,_void> *)local_e38);
            puVar21 = (uint *)local_c18;
            pcVar12 = &local_d18;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_d18.exp = iStack_ba8;
            local_d18.neg = bStack_ba4;
            local_d18.fpclass = (fpclass_type)local_ba0;
            local_d18.prec_elem = local_ba0._4_4_;
            if ((bStack_ba4 == true) &&
               ((fpclass_type)local_ba0 != cpp_dec_float_finite || local_d18.data._M_elems[0] != 0))
            {
              local_d18.neg = false;
            }
            local_e50._0_4_ = cpp_dec_float_finite;
            local_e50._4_4_ = 0x1c;
            bStack_e54 = false;
            iStack_e58 = 0;
            puVar21 = (uint *)local_c98;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            }
            iStack_e58 = iStack_c28;
            bStack_e54 = bStack_c24;
            local_e50._0_4_ = (fpclass_type)local_c20;
            local_e50._4_4_ = local_c20._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_ec8,&local_d18);
LAB_005a2727:
            pnVar11 = (this->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar18 = (undefined4 *)local_ec8;
            puVar22 = (undefined4 *)((long)&pnVar11[-1].m_backend.data + lVar26);
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              *puVar22 = *puVar18;
              puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
              puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            }
            *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_e58;
            *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_e54;
            *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_e50;
          }
        }
        dVar15 = (double)((long)local_e48 - 1);
        lVar26 = lVar26 + -0x80;
      } while (1 < (long)dVar15);
    }
    dVar15 = (double)(long)(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
    if (0 < (long)dVar15) {
      local_a18 = *(double *)(in_FS_OFFSET + -8);
      uStack_a10 = 0;
      local_908 = -local_a18;
      uStack_900 = 0x8000000000000000;
      do {
        dVar1 = (double)((long)dVar15 - 1);
        local_db8 = dVar15;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_c18,1,(type *)0x0);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_a98,0,(type *)0x0);
        local_e50._0_4_ = cpp_dec_float_finite;
        local_e50._4_4_ = 0x1c;
        bStack_e54 = false;
        iStack_e58 = 0;
        pcVar12 = &local_8f8;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
        }
        iStack_e58 = local_8f8.exp;
        bStack_e54 = local_8f8.neg;
        local_e50._0_4_ = local_8f8.fpclass;
        local_e50._4_4_ = local_8f8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                   (cpp_dec_float<200U,_int,_void> *)local_c18);
        pcVar19 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar1].m_backend;
        local_d20._0_4_ = cpp_dec_float_finite;
        local_d20._4_4_ = 0x1c;
        local_d38[0] = 0;
        local_d38[1] = 0;
        stack0xfffffffffffff2d0 = 0;
        local_d48 = (undefined1  [16])0x0;
        local_d58 = (undefined1  [16])0x0;
        local_d68 = (undefined1  [16])0x0;
        local_d78 = (undefined1  [16])0x0;
        local_d88 = (undefined1  [16])0x0;
        local_d98 = (undefined1  [16])0x0;
        uStack_d2b = 0;
        iStack_d28 = 0;
        bStack_d24 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
        if ((cpp_dec_float<200U,_int,_void> *)local_d98 != pcVar19) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_d98;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
          }
          iStack_d28 = iStack_e58;
          bStack_d24 = bStack_e54;
          local_d20._0_4_ = (fpclass_type)local_e50;
          local_d20._4_4_ = local_e50._4_4_;
          pcVar12 = pcVar19;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_d98,pcVar12);
        local_e50._0_4_ = cpp_dec_float_finite;
        local_e50._4_4_ = 0x1c;
        bStack_e54 = false;
        iStack_e58 = 0;
        pcVar12 = &local_8f8;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
        }
        iStack_e58 = local_8f8.exp;
        bStack_e54 = local_8f8.neg;
        local_e50._0_4_ = local_8f8.fpclass;
        local_e50._4_4_ = local_8f8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                   (cpp_dec_float<200U,_int,_void> *)local_c18);
        pcVar19 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar1].m_backend;
        local_c20._0_4_ = cpp_dec_float_finite;
        local_c20._4_4_ = 0x1c;
        local_c38 = SUB1613((undefined1  [16])0x0,0);
        local_c48 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c78 = (undefined1  [16])0x0;
        local_c98._16_16_ = (undefined1  [16])0x0;
        local_c98._0_16_ = (undefined1  [16])0x0;
        uStack_c2b = 0;
        iStack_c28 = 0;
        bStack_c24 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
        if ((cpp_dec_float<200U,_int,_void> *)local_c98 != pcVar19) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_c98;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
          }
          iStack_c28 = iStack_e58;
          bStack_c24 = bStack_e54;
          local_c20._0_4_ = (fpclass_type)local_e50;
          local_c20._4_4_ = local_e50._4_4_;
          pcVar12 = pcVar19;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_c98,pcVar12);
        local_b18.fpclass = cpp_dec_float_finite;
        local_b18.prec_elem = 0x1c;
        local_b18.neg = false;
        local_b18.exp = 0;
        puVar21 = (uint *)local_a08;
        pcVar12 = &local_b18;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
        }
        local_b18.exp = iStack_998;
        local_b18.neg = bStack_994;
        local_b18.fpclass = (fpclass_type)local_990;
        local_b18.prec_elem = local_990._4_4_;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_b18,(cpp_dec_float<200U,_int,_void> *)local_c18);
        pIVar7 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        local_e48 = dVar1;
        iVar10 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[(long)dVar1].idx;
        local_e50._0_4_ = cpp_dec_float_finite;
        local_e50._4_4_ = 0x1c;
        local_ec8 = (undefined1  [16])0x0;
        local_eb8 = (undefined1  [16])0x0;
        local_ea8 = (undefined1  [16])0x0;
        local_e98 = (undefined1  [16])0x0;
        local_e88 = (undefined1  [16])0x0;
        local_e78 = (undefined1  [16])0x0;
        local_e68[0] = 0;
        local_e68[1] = 0;
        stack0xfffffffffffff1a0 = 0;
        uStack_e5b = 0;
        iStack_e58 = 0;
        bStack_e54 = false;
        lVar26 = (long)pIVar7[iVar10].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (0 < lVar26) {
          lVar27 = lVar26 + 1;
          lVar26 = lVar26 * 0x84;
          do {
            pNVar8 = pIVar7[iVar10].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)&pNVar8[-1].val.m_backend.data + lVar26);
            pcVar20 = &(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          *)&local_da8->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )->
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       )._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar8[-1].val + 1) + lVar26)].m_backend;
            local_dc0._0_4_ = cpp_dec_float_finite;
            local_dc0._4_4_ = 0x1c;
            local_e38._0_16_ = (undefined1  [16])0x0;
            local_e38._16_16_ = (undefined1  [16])0x0;
            local_e18 = (undefined1  [16])0x0;
            local_e08 = (undefined1  [16])0x0;
            local_df8 = (undefined1  [16])0x0;
            local_de8 = (undefined1  [16])0x0;
            local_dd8 = SUB1613((undefined1  [16])0x0,0);
            uStack_dcb = 0;
            iStack_dc8 = 0;
            bStack_dc4 = false;
            pcVar12 = pcVar20;
            if ((pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_e38) &&
               (pcVar12 = pcVar19, (cpp_dec_float<200U,_int,_void> *)local_e38 != pcVar20)) {
              pcVar19 = pcVar20;
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_e38;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4)
                ;
              }
              iStack_dc8 = pcVar20->exp;
              bStack_dc4 = pcVar20->neg;
              local_dc0._0_4_ = pcVar20->fpclass;
              local_dc0._4_4_ = pcVar20->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_e38,pcVar12);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                       (cpp_dec_float<200U,_int,_void> *)local_e38);
            lVar27 = lVar27 + -1;
            lVar26 = lVar26 + -0x84;
          } while (1 < lVar27);
        }
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_e38;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
        }
        iStack_dc8 = iStack_e58;
        bStack_dc4 = bStack_e54;
        local_dc0._0_4_ = (fpclass_type)local_e50;
        local_dc0._4_4_ = local_e50._4_4_;
        local_d18.fpclass = cpp_dec_float_finite;
        local_d18.prec_elem = 0x1c;
        local_d18.neg = false;
        local_d18.exp = 0;
        pcVar12 = &local_b18;
        pcVar19 = &local_d18;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4)
          ;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
        }
        local_d18.exp = local_b18.exp;
        local_d18.neg = local_b18.neg;
        local_d18.fpclass = local_b18.fpclass;
        local_d18.prec_elem = local_b18.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_e38);
        pcVar12 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar1].m_backend;
        ::soplex::infinity::__tls_init();
        local_e50._0_4_ = cpp_dec_float_finite;
        local_e50._4_4_ = 0x1c;
        local_ec8 = (undefined1  [16])0x0;
        local_eb8 = (undefined1  [16])0x0;
        local_ea8 = (undefined1  [16])0x0;
        local_e98 = (undefined1  [16])0x0;
        local_e88 = (undefined1  [16])0x0;
        local_e78 = (undefined1  [16])0x0;
        local_e68[0] = 0;
        local_e68[1] = 0;
        stack0xfffffffffffff1a0 = 0;
        uStack_e5b = 0;
        iStack_e58 = 0;
        bStack_e54 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_ec8,local_a18);
        if (((pcVar12->fpclass == cpp_dec_float_NaN) ||
            ((fpclass_type)local_e50 == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (pcVar12,(cpp_dec_float<200U,_int,_void> *)local_ec8), -1 < iVar10))
        {
          pcVar12 = &(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar1].m_backend;
          ::soplex::infinity::__tls_init();
          local_e50._0_4_ = cpp_dec_float_finite;
          local_e50._4_4_ = 0x1c;
          local_ec8 = ZEXT816(0);
          local_eb8 = ZEXT816(0);
          local_ea8 = ZEXT816(0);
          local_e98 = ZEXT816(0);
          local_e88 = ZEXT816(0);
          local_e78 = ZEXT816(0);
          local_e68[0] = 0;
          local_e68[1] = 0;
          stack0xfffffffffffff1a0 = 0;
          uStack_e5b = 0;
          iStack_e58 = 0;
          bStack_e54 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_ec8,local_908);
          if (((pcVar12->fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_e50 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (pcVar12,(cpp_dec_float<200U,_int,_void> *)local_ec8), iVar10 < 1))
          {
            local_dc0._0_4_ = cpp_dec_float_finite;
            local_dc0._4_4_ = 0x1c;
            bStack_dc4 = false;
            iStack_dc8 = 0;
            puVar21 = (uint *)local_b98;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            }
            iStack_dc8 = iStack_b28;
            bStack_dc4 = bStack_b24;
            local_dc0._0_4_ = (fpclass_type)local_b20;
            local_dc0._4_4_ = local_b20._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_e38,
                       (cpp_dec_float<200U,_int,_void> *)local_a98);
            dVar15 = local_e48;
            pcVar12 = &local_d18;
            pcVar19 = &local_b18;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar19 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_b18.exp = local_d18.exp;
            local_b18.neg = local_d18.neg;
            local_b18.fpclass = local_d18.fpclass;
            local_b18.prec_elem = local_d18.prec_elem;
            if ((local_d18.neg == true) &&
               (local_d18.fpclass != cpp_dec_float_finite || local_b18.data._M_elems[0] != 0)) {
              local_b18.neg = false;
            }
            local_e50._0_4_ = cpp_dec_float_finite;
            local_e50._4_4_ = 0x1c;
            bStack_e54 = false;
            iStack_e58 = 0;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_e58 = iStack_dc8;
            bStack_e54 = bStack_dc4;
            local_e50._0_4_ = (fpclass_type)local_dc0;
            local_e50._4_4_ = local_dc0._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_ec8,&local_b18);
            pnVar11 = (this->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            pnVar24 = pnVar11 + (long)dVar1;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar24->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            pnVar11[(long)dVar1].m_backend.exp = iStack_e58;
            pnVar11[(long)dVar1].m_backend.neg = bStack_e54;
            pnVar11[(long)dVar1].m_backend.fpclass = (fpclass_type)local_e50;
            pnVar11[(long)dVar1].m_backend.prec_elem = local_e50._4_4_;
          }
          else {
            local_b18.fpclass = cpp_dec_float_finite;
            local_b18.prec_elem = 0x1c;
            local_b18.neg = false;
            local_b18.exp = 0;
            pcVar12 = &local_578;
            pcVar19 = &local_b18;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            local_b18.exp = local_578.exp;
            local_b18.neg = local_578.neg;
            local_b18.fpclass = local_578.fpclass;
            local_b18.prec_elem = local_578.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&local_b18,(cpp_dec_float<200U,_int,_void> *)local_c98);
            local_dc0._0_4_ = cpp_dec_float_finite;
            local_dc0._4_4_ = 0x1c;
            iStack_dc8 = 0;
            bStack_dc4 = false;
            pcVar12 = &local_b18;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_e38;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_dc8 = local_b18.exp;
            bStack_dc4 = local_b18.neg;
            local_dc0._0_4_ = local_b18.fpclass;
            local_dc0._4_4_ = local_b18.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_e38,
                       (cpp_dec_float<200U,_int,_void> *)local_a98);
            local_e50._0_4_ = cpp_dec_float_finite;
            local_e50._4_4_ = 0x1c;
            iStack_e58 = 0;
            bStack_e54 = false;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_e58 = iStack_dc8;
            bStack_e54 = bStack_dc4;
            local_e50._0_4_ = (fpclass_type)local_dc0;
            local_e50._4_4_ = local_dc0._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_ec8,&local_d18);
            pnVar11 = (this->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            pnVar24 = pnVar11 + (long)dVar1;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar24->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            pnVar11[(long)dVar1].m_backend.exp = iStack_e58;
            pnVar11[(long)dVar1].m_backend.neg = bStack_e54;
            pnVar11[(long)dVar1].m_backend.fpclass = (fpclass_type)local_e50;
            pnVar11[(long)dVar1].m_backend.prec_elem = local_e50._4_4_;
            (this->rowRight).data[(long)local_e48] = false;
            dVar15 = local_e48;
          }
        }
        else {
          pcVar19 = &(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar1].m_backend;
          pcVar12 = &(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar1].m_backend;
          local_878.fpclass = cpp_dec_float_finite;
          local_878.prec_elem = 0x1c;
          local_878.data._M_elems[0] = 0;
          local_878.data._M_elems[1] = 0;
          local_878.data._M_elems[2] = 0;
          local_878.data._M_elems[3] = 0;
          local_878.data._M_elems[4] = 0;
          local_878.data._M_elems[5] = 0;
          local_878.data._M_elems[6] = 0;
          local_878.data._M_elems[7] = 0;
          local_878.data._M_elems[8] = 0;
          local_878.data._M_elems[9] = 0;
          local_878.data._M_elems[10] = 0;
          local_878.data._M_elems[0xb] = 0;
          local_878.data._M_elems[0xc] = 0;
          local_878.data._M_elems[0xd] = 0;
          local_878.data._M_elems[0xe] = 0;
          local_878.data._M_elems[0xf] = 0;
          local_878.data._M_elems[0x10] = 0;
          local_878.data._M_elems[0x11] = 0;
          local_878.data._M_elems[0x12] = 0;
          local_878.data._M_elems[0x13] = 0;
          local_878.data._M_elems[0x14] = 0;
          local_878.data._M_elems[0x15] = 0;
          local_878.data._M_elems[0x16] = 0;
          local_878.data._M_elems[0x17] = 0;
          local_878.data._M_elems[0x18] = 0;
          local_878.data._M_elems[0x19] = 0;
          local_878.data._M_elems._104_5_ = 0;
          local_878.data._M_elems[0x1b]._1_3_ = 0;
          local_878.exp = 0;
          local_878.neg = false;
          if (&local_878 == pcVar12) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_878,pcVar19);
            if (local_878.data._M_elems[0] != 0 || local_878.fpclass != cpp_dec_float_finite) {
              local_878.neg = (bool)(local_878.neg ^ 1);
            }
          }
          else {
            if (&local_878 != pcVar19) {
              pcVar20 = pcVar19;
              pcVar23 = &local_878;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_878.exp = pcVar19->exp;
              local_878.neg = pcVar19->neg;
              local_878.fpclass = pcVar19->fpclass;
              local_878.prec_elem = pcVar19->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_878,pcVar12);
          }
          local_e50._0_4_ = cpp_dec_float_finite;
          local_e50._4_4_ = 0x1c;
          bStack_e54 = false;
          iStack_e58 = 0;
          pcVar12 = &local_878;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
          }
          iStack_e58 = local_878.exp;
          bStack_e54 = local_878.neg;
          local_e50._0_4_ = local_878.fpclass;
          local_e50._4_4_ = local_878.prec_elem;
          if ((local_878.neg == true) &&
             (local_ec8._0_4_ != 0 || local_878.fpclass != cpp_dec_float_finite)) {
            bStack_e54 = false;
          }
          if (((local_878.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_200 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                                  (cpp_dec_float<200U,_int,_void> *)local_278), -1 < iVar10)) {
            pcVar12 = &(base->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar1].m_backend;
            ::soplex::infinity::__tls_init();
            local_e50._0_4_ = cpp_dec_float_finite;
            local_e50._4_4_ = 0x1c;
            local_ec8 = (undefined1  [16])0x0;
            local_eb8 = (undefined1  [16])0x0;
            local_ea8 = (undefined1  [16])0x0;
            local_e98 = (undefined1  [16])0x0;
            local_e88 = (undefined1  [16])0x0;
            local_e78 = (undefined1  [16])0x0;
            local_e68[0] = 0;
            local_e68[1] = 0;
            stack0xfffffffffffff1a0 = 0;
            uStack_e5b = 0;
            iStack_e58 = 0;
            bStack_e54 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_ec8,local_908);
            if (((pcVar12->fpclass == cpp_dec_float_NaN) ||
                ((fpclass_type)local_e50 == cpp_dec_float_NaN)) ||
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (pcVar12,(cpp_dec_float<200U,_int,_void> *)local_ec8), iVar10 < 1
               )) {
              local_b18.fpclass = cpp_dec_float_finite;
              local_b18.prec_elem = 0x1c;
              local_b18.neg = false;
              local_b18.exp = 0;
              pcVar12 = &local_578;
              pcVar19 = &local_b18;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_b18.exp = local_578.exp;
              local_b18.neg = local_578.neg;
              local_b18.fpclass = local_578.fpclass;
              local_b18.prec_elem = local_578.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_b18,(cpp_dec_float<200U,_int,_void> *)local_d98);
              local_dc0._0_4_ = cpp_dec_float_finite;
              local_dc0._4_4_ = 0x1c;
              iStack_dc8 = 0;
              bStack_dc4 = false;
              pcVar12 = &local_b18;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_e38;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              iStack_dc8 = local_b18.exp;
              bStack_dc4 = local_b18.neg;
              local_dc0._0_4_ = local_b18.fpclass;
              local_dc0._4_4_ = local_b18.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_e38,
                         (cpp_dec_float<200U,_int,_void> *)local_a98);
              local_e50._0_4_ = cpp_dec_float_finite;
              local_e50._4_4_ = 0x1c;
              iStack_e58 = 0;
              bStack_e54 = false;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              pcVar12 = &local_d18;
LAB_005a3d1d:
              iStack_e58 = iStack_dc8;
              bStack_e54 = bStack_dc4;
              local_e50 = local_dc0;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_ec8,pcVar12);
              pnVar11 = (this->rowWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
              pnVar24 = pnVar11 + (long)dVar1;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pnVar24->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              pnVar11[(long)dVar1].m_backend.exp = iStack_e58;
              pnVar11[(long)dVar1].m_backend.neg = bStack_e54;
              pnVar11[(long)dVar1].m_backend.fpclass = (fpclass_type)local_e50;
              pnVar11[(long)dVar1].m_backend.prec_elem = local_e50._4_4_;
              (this->rowRight).data[(long)local_e48] = true;
              dVar15 = local_e48;
            }
            else {
              if (local_d18.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_ec8,0,(type *)0x0);
                iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_ec8);
                if (0 < iVar10) {
                  local_b18.fpclass = cpp_dec_float_finite;
                  local_b18.prec_elem = 0x1c;
                  local_b18.neg = false;
                  local_b18.exp = 0;
                  pcVar12 = &local_678;
                  pcVar19 = &local_b18;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                  }
                  local_b18.exp = local_678.exp;
                  local_b18.neg = local_678.neg;
                  local_b18.fpclass = local_678.fpclass;
                  local_b18.prec_elem = local_678.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            (&local_b18,&local_d18);
                  local_dc0._0_4_ = cpp_dec_float_finite;
                  local_dc0._4_4_ = 0x1c;
                  iStack_dc8 = 0;
                  bStack_dc4 = false;
                  pcVar12 = &local_b18;
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_e38;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                  }
                  iStack_dc8 = local_b18.exp;
                  bStack_dc4 = local_b18.neg;
                  local_dc0._0_4_ = local_b18.fpclass;
                  local_dc0._4_4_ = local_b18.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_e38,
                             (cpp_dec_float<200U,_int,_void> *)local_d98);
                  local_e50._0_4_ = cpp_dec_float_finite;
                  local_e50._4_4_ = 0x1c;
                  iStack_e58 = 0;
                  bStack_e54 = false;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                  }
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a98;
                  goto LAB_005a3d1d;
                }
              }
              local_b18.fpclass = cpp_dec_float_finite;
              local_b18.prec_elem = 0x1c;
              local_b18.neg = false;
              local_b18.exp = 0;
              pcVar12 = &local_678;
              pcVar19 = &local_b18;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_b18.exp = local_678.exp;
              local_b18.neg = local_678.neg;
              local_b18.fpclass = local_678.fpclass;
              local_b18.prec_elem = local_678.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_b18,&local_d18);
              local_dc0._0_4_ = cpp_dec_float_finite;
              local_dc0._4_4_ = 0x1c;
              iStack_dc8 = 0;
              bStack_dc4 = false;
              pcVar12 = &local_b18;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_e38;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              iStack_dc8 = local_b18.exp;
              bStack_dc4 = local_b18.neg;
              local_dc0._0_4_ = local_b18.fpclass;
              local_dc0._4_4_ = local_b18.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_e38,
                         (cpp_dec_float<200U,_int,_void> *)local_c98);
              local_e50._0_4_ = cpp_dec_float_finite;
              local_e50._4_4_ = 0x1c;
              iStack_e58 = 0;
              bStack_e54 = false;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              iStack_e58 = iStack_dc8;
              bStack_e54 = bStack_dc4;
              local_e50._0_4_ = (fpclass_type)local_dc0;
              local_e50._4_4_ = local_dc0._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                         (cpp_dec_float<200U,_int,_void> *)local_a98);
              pnVar11 = (this->rowWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
              pnVar24 = pnVar11 + (long)dVar1;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pnVar24->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              pnVar11[(long)dVar1].m_backend.exp = iStack_e58;
              pnVar11[(long)dVar1].m_backend.neg = bStack_e54;
              pnVar11[(long)dVar1].m_backend.fpclass = (fpclass_type)local_e50;
              pnVar11[(long)dVar1].m_backend.prec_elem = local_e50._4_4_;
              (this->rowRight).data[(long)local_e48] = false;
              dVar15 = local_e48;
            }
          }
          else {
            local_dc0._0_4_ = cpp_dec_float_finite;
            local_dc0._4_4_ = 0x1c;
            bStack_dc4 = false;
            iStack_dc8 = 0;
            puVar21 = (uint *)&local_3f8;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            }
            iStack_dc8 = iStack_388;
            bStack_dc4 = (bool)bStack_384;
            local_dc0._0_4_ = (fpclass_type)local_380;
            local_dc0._4_4_ = local_380._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_e38,
                       (cpp_dec_float<200U,_int,_void> *)local_a98);
            pcVar12 = &local_d18;
            pcVar19 = &local_b18;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar19 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_b18.exp = local_d18.exp;
            local_b18.neg = local_d18.neg;
            local_b18.fpclass = local_d18.fpclass;
            local_b18.prec_elem = local_d18.prec_elem;
            if ((local_d18.neg == true) &&
               (local_d18.fpclass != cpp_dec_float_finite || local_b18.data._M_elems[0] != 0)) {
              local_b18.neg = false;
            }
            local_e50._0_4_ = cpp_dec_float_finite;
            local_e50._4_4_ = 0x1c;
            bStack_e54 = false;
            iStack_e58 = 0;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_e58 = iStack_dc8;
            bStack_e54 = bStack_dc4;
            local_e50._0_4_ = (fpclass_type)local_dc0;
            local_e50._4_4_ = local_dc0._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_ec8,&local_b18);
            pnVar11 = (this->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
            pnVar24 = pnVar11 + (long)dVar1;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar24->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            pnVar11[(long)dVar1].m_backend.exp = iStack_e58;
            pnVar11[(long)dVar1].m_backend.neg = bStack_e54;
            pnVar11[(long)dVar1].m_backend.fpclass = (fpclass_type)local_e50;
            pnVar11[(long)dVar1].m_backend.prec_elem = local_e50._4_4_;
            dVar15 = local_e48;
          }
        }
      } while (1 < (long)local_db8);
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_a08,this_00);
    local_dc0._0_4_ = cpp_dec_float_finite;
    local_dc0._4_4_ = 0x1c;
    local_e38._0_16_ = (undefined1  [16])0x0;
    local_e38._16_16_ = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8 = (undefined1  [16])0x0;
    local_de8 = (undefined1  [16])0x0;
    local_dd8 = SUB1613((undefined1  [16])0x0,0);
    uStack_dcb = 0;
    iStack_dc8 = 0;
    bStack_dc4 = false;
    local_e50._0_4_ = cpp_dec_float_finite;
    local_e50._4_4_ = 0x1c;
    local_ec8 = (undefined1  [16])0x0;
    local_eb8 = (undefined1  [16])0x0;
    local_ea8 = (undefined1  [16])0x0;
    local_e98 = (undefined1  [16])0x0;
    local_e88 = (undefined1  [16])0x0;
    local_e78 = (undefined1  [16])0x0;
    local_e68[0] = 0;
    local_e68[1] = 0;
    stack0xfffffffffffff1a0 = 0;
    uStack_e5b = 0;
    iStack_e58 = 0;
    bStack_e54 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_ec8,0.001);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_e38,
               (cpp_dec_float<200U,_int,_void> *)local_ec8,
               (cpp_dec_float<200U,_int,_void> *)local_a08);
    local_990._0_4_ = cpp_dec_float_finite;
    local_990._4_4_ = 0x1c;
    local_a08 = ZEXT816(0);
    local_9f8 = ZEXT816(0);
    local_9e8 = ZEXT816(0);
    local_9d8 = ZEXT816(0);
    local_9c8 = ZEXT816(0);
    local_9b8 = ZEXT816(0);
    local_9a8[0] = 0;
    local_9a8[1] = 0;
    stack0xfffffffffffff660 = 0;
    uStack_99b = 0;
    iStack_998 = 0;
    bStack_994 = false;
    local_e50._0_4_ = cpp_dec_float_finite;
    local_e50._4_4_ = 0x1c;
    local_ec8 = ZEXT816(0);
    local_eb8 = ZEXT816(0);
    local_ea8 = ZEXT816(0);
    local_e98 = ZEXT816(0);
    local_e88 = ZEXT816(0);
    local_e78 = ZEXT816(0);
    local_e68[0] = 0;
    local_e68[1] = 0;
    stack0xfffffffffffff1a0 = 0;
    uStack_e5b = 0;
    iStack_e58 = 0;
    bStack_e54 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_ec8,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_a08,
               (cpp_dec_float<200U,_int,_void> *)local_ec8,&local_988);
    local_8f8.fpclass = cpp_dec_float_finite;
    local_8f8.prec_elem = 0x1c;
    local_8f8.data._M_elems[0] = 0;
    local_8f8.data._M_elems[1] = 0;
    local_8f8.data._M_elems[2] = 0;
    local_8f8.data._M_elems[3] = 0;
    local_8f8.data._M_elems[4] = 0;
    local_8f8.data._M_elems[5] = 0;
    local_8f8.data._M_elems[6] = 0;
    local_8f8.data._M_elems[7] = 0;
    local_8f8.data._M_elems[8] = 0;
    local_8f8.data._M_elems[9] = 0;
    local_8f8.data._M_elems[10] = 0;
    local_8f8.data._M_elems[0xb] = 0;
    local_8f8.data._M_elems[0xc] = 0;
    local_8f8.data._M_elems[0xd] = 0;
    local_8f8.data._M_elems[0xe] = 0;
    local_8f8.data._M_elems[0xf] = 0;
    local_8f8.data._M_elems[0x10] = 0;
    local_8f8.data._M_elems[0x11] = 0;
    local_8f8.data._M_elems[0x12] = 0;
    local_8f8.data._M_elems[0x13] = 0;
    local_8f8.data._M_elems[0x14] = 0;
    local_8f8.data._M_elems[0x15] = 0;
    local_8f8.data._M_elems[0x16] = 0;
    local_8f8.data._M_elems[0x17] = 0;
    local_8f8.data._M_elems[0x18] = 0;
    local_8f8.data._M_elems[0x19] = 0;
    local_8f8.data._M_elems._104_5_ = 0;
    local_8f8.data._M_elems[0x1b]._1_3_ = 0;
    local_8f8.exp = 0;
    local_8f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_ec8,
               (long)(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_8f8,(cpp_dec_float<200U,_int,_void> *)local_e38,
               (cpp_dec_float<200U,_int,_void> *)local_ec8);
    local_2f8.fpclass = cpp_dec_float_finite;
    local_2f8.prec_elem = 0x1c;
    local_2f8.data._M_elems[0] = 0;
    local_2f8.data._M_elems[1] = 0;
    local_2f8.data._M_elems[2] = 0;
    local_2f8.data._M_elems[3] = 0;
    local_2f8.data._M_elems[4] = 0;
    local_2f8.data._M_elems[5] = 0;
    local_2f8.data._M_elems[6] = 0;
    local_2f8.data._M_elems[7] = 0;
    local_2f8.data._M_elems[8] = 0;
    local_2f8.data._M_elems[9] = 0;
    local_2f8.data._M_elems[10] = 0;
    local_2f8.data._M_elems[0xb] = 0;
    local_2f8.data._M_elems[0xc] = 0;
    local_2f8.data._M_elems[0xd] = 0;
    local_2f8.data._M_elems[0xe] = 0;
    local_2f8.data._M_elems[0xf] = 0;
    local_2f8.data._M_elems[0x10] = 0;
    local_2f8.data._M_elems[0x11] = 0;
    local_2f8.data._M_elems[0x12] = 0;
    local_2f8.data._M_elems[0x13] = 0;
    local_2f8.data._M_elems[0x14] = 0;
    local_2f8.data._M_elems[0x15] = 0;
    local_2f8.data._M_elems[0x16] = 0;
    local_2f8.data._M_elems[0x17] = 0;
    local_2f8.data._M_elems[0x18] = 0;
    local_2f8.data._M_elems[0x19] = 0;
    local_2f8.data._M_elems._104_5_ = 0;
    local_2f8.data._M_elems[0x1b]._1_3_ = 0;
    local_2f8.exp = 0;
    local_2f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2f8,100000.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_378,0,(type *)0x0);
    local_380._0_4_ = cpp_dec_float_finite;
    local_380._4_4_ = 0x1c;
    local_3f8 = 0;
    uStack_3f0 = 0;
    local_3e8 = 0;
    uStack_3e0 = 0;
    local_3d8 = 0;
    uStack_3d0 = 0;
    local_3c8 = 0;
    uStack_3c0 = 0;
    local_3b8 = 0;
    uStack_3b0 = 0;
    local_3a8 = 0;
    uStack_3a0 = 0;
    local_398 = 0;
    uStack_390 = 0;
    uStack_38b = 0;
    iStack_388 = 0;
    bStack_384 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3f8,10.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_4f8,0,(type *)0x0);
    local_678.fpclass = cpp_dec_float_finite;
    local_678.prec_elem = 0x1c;
    local_678.data._M_elems[0] = 0;
    local_678.data._M_elems[1] = 0;
    local_678.data._M_elems[2] = 0;
    local_678.data._M_elems[3] = 0;
    local_678.data._M_elems[4] = 0;
    local_678.data._M_elems[5] = 0;
    local_678.data._M_elems[6] = 0;
    local_678.data._M_elems[7] = 0;
    local_678.data._M_elems[8] = 0;
    local_678.data._M_elems[9] = 0;
    local_678.data._M_elems[10] = 0;
    local_678.data._M_elems[0xb] = 0;
    local_678.data._M_elems[0xc] = 0;
    local_678.data._M_elems[0xd] = 0;
    local_678.data._M_elems[0xe] = 0;
    local_678.data._M_elems[0xf] = 0;
    local_678.data._M_elems[0x10] = 0;
    local_678.data._M_elems[0x11] = 0;
    local_678.data._M_elems[0x12] = 0;
    local_678.data._M_elems[0x13] = 0;
    local_678.data._M_elems[0x14] = 0;
    local_678.data._M_elems[0x15] = 0;
    local_678.data._M_elems[0x16] = 0;
    local_678.data._M_elems[0x17] = 0;
    local_678.data._M_elems[0x18] = 0;
    local_678.data._M_elems[0x19] = 0;
    local_678.data._M_elems._104_5_ = 0;
    local_678.data._M_elems[0x1b]._1_3_ = 0;
    local_678.exp = 0;
    local_678.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_678,10.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_5f8,0,(type *)0x0);
    local_578.fpclass = cpp_dec_float_finite;
    local_578.prec_elem = 0x1c;
    local_578.data._M_elems[0] = 0;
    local_578.data._M_elems[1] = 0;
    local_578.data._M_elems[2] = 0;
    local_578.data._M_elems[3] = 0;
    local_578.data._M_elems[4] = 0;
    local_578.data._M_elems[5] = 0;
    local_578.data._M_elems[6] = 0;
    local_578.data._M_elems[7] = 0;
    local_578.data._M_elems[8] = 0;
    local_578.data._M_elems[9] = 0;
    local_578.data._M_elems[10] = 0;
    local_578.data._M_elems[0xb] = 0;
    local_578.data._M_elems[0xc] = 0;
    local_578.data._M_elems[0xd] = 0;
    local_578.data._M_elems[0xe] = 0;
    local_578.data._M_elems[0xf] = 0;
    local_578.data._M_elems[0x10] = 0;
    local_578.data._M_elems[0x11] = 0;
    local_578.data._M_elems[0x12] = 0;
    local_578.data._M_elems[0x13] = 0;
    local_578.data._M_elems[0x14] = 0;
    local_578.data._M_elems[0x15] = 0;
    local_578.data._M_elems[0x16] = 0;
    local_578.data._M_elems[0x17] = 0;
    local_578.data._M_elems[0x18] = 0;
    local_578.data._M_elems[0x19] = 0;
    local_578.data._M_elems._104_5_ = 0;
    local_578.data._M_elems[0x1b]._1_3_ = 0;
    local_578.exp = 0;
    local_578.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_578,-10000.0);
    local_400._0_4_ = cpp_dec_float_finite;
    local_400._4_4_ = 0x1c;
    local_478 = 0;
    uStack_470 = 0;
    local_468 = 0;
    uStack_460 = 0;
    local_458 = 0;
    uStack_450 = 0;
    local_448 = 0;
    uStack_440 = 0;
    local_438 = 0;
    uStack_430 = 0;
    local_428 = 0;
    uStack_420 = 0;
    local_418 = 0;
    uStack_410 = 0;
    uStack_40b = 0;
    iStack_408 = 0;
    bStack_404 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_478,-100000.0);
    lVar26 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    local_da8 = base;
    if (0 < lVar26) {
      local_e48 = *(double *)(in_FS_OFFSET + -8);
      uStack_e40 = 0;
      local_db8 = -local_e48;
      uStack_db0 = 0x8000000000000000;
      lVar27 = lVar26 + 1;
      lVar26 = lVar26 << 7;
      do {
        pSVar9 = local_da8;
        local_b20._0_4_ = cpp_dec_float_finite;
        local_b20._4_4_ = 0x1c;
        local_b98 = (undefined1  [16])0x0;
        local_b88 = (undefined1  [16])0x0;
        local_b78 = (undefined1  [16])0x0;
        local_b68 = (undefined1  [16])0x0;
        local_b58 = (undefined1  [16])0x0;
        local_b48 = (undefined1  [16])0x0;
        local_b38[0] = 0;
        local_b38[1] = 0;
        stack0xfffffffffffff4d0 = 0;
        uStack_b2b = 0;
        iStack_b28 = 0;
        bStack_b24 = false;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                   (long)(local_da8->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(local_da8->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[lVar27 + -2].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused + -1,(type *)0x0);
        pcVar12 = &local_8f8;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_b98;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
        }
        iStack_b28 = local_8f8.exp;
        bStack_b24 = local_8f8.neg;
        local_b20._0_4_ = local_8f8.fpclass;
        local_b20._4_4_ = local_8f8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_b98,
                   (cpp_dec_float<200U,_int,_void> *)local_ec8);
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(pSVar9->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
        local_e50._0_4_ = cpp_dec_float_finite;
        local_e50._4_4_ = 0x1c;
        local_ec8 = (undefined1  [16])0x0;
        local_eb8 = (undefined1  [16])0x0;
        local_ea8 = (undefined1  [16])0x0;
        local_e98 = (undefined1  [16])0x0;
        local_e88 = (undefined1  [16])0x0;
        local_e78 = (undefined1  [16])0x0;
        local_e68[0] = 0;
        local_e68[1] = 0;
        stack0xfffffffffffff1a0 = 0;
        uStack_e5b = 0;
        iStack_e58 = 0;
        bStack_e54 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_e38;
        if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_ec8) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
          }
          iStack_e58 = iStack_dc8;
          bStack_e54 = bStack_dc4;
          local_e50._0_4_ = (fpclass_type)local_dc0;
          local_e50._4_4_ = local_dc0._4_4_;
          pcVar12 = pcVar19;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_ec8,pcVar12);
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(local_da8->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
        local_ba0._0_4_ = cpp_dec_float_finite;
        local_ba0._4_4_ = 0x1c;
        local_c18._0_16_ = (undefined1  [16])0x0;
        local_c18._16_16_ = (undefined1  [16])0x0;
        local_bf8 = (undefined1  [16])0x0;
        local_be8 = (undefined1  [16])0x0;
        local_bd8 = (undefined1  [16])0x0;
        local_bc8 = (undefined1  [16])0x0;
        local_bb8 = SUB1613((undefined1  [16])0x0,0);
        uStack_bab = 0;
        iStack_ba8 = 0;
        bStack_ba4 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a08;
        if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_c18) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_c18;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
          }
          iStack_ba8 = iStack_998;
          bStack_ba4 = bStack_994;
          local_ba0._0_4_ = (fpclass_type)local_990;
          local_ba0._4_4_ = local_990._4_4_;
          pcVar12 = pcVar19;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_c18,pcVar12);
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(local_da8->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
        local_a20._0_4_ = cpp_dec_float_finite;
        local_a20._4_4_ = 0x1c;
        local_a98._0_16_ = (undefined1  [16])0x0;
        local_a98._16_16_ = (undefined1  [16])0x0;
        local_a78 = (undefined1  [16])0x0;
        local_a68 = (undefined1  [16])0x0;
        local_a58 = (undefined1  [16])0x0;
        local_a48 = (undefined1  [16])0x0;
        local_a38 = SUB1613((undefined1  [16])0x0,0);
        uStack_a2b = 0;
        iStack_a28 = 0;
        bStack_a24 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a08;
        if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_a98) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_a98;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
          }
          iStack_a28 = iStack_998;
          bStack_a24 = bStack_994;
          local_a20._0_4_ = (fpclass_type)local_990;
          local_a20._4_4_ = local_990._4_4_;
          pcVar12 = pcVar19;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_a98,pcVar12);
        pnVar11 = (local_da8->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_d20._0_4_ = cpp_dec_float_finite;
        local_d20._4_4_ = 0x1c;
        local_d98 = (undefined1  [16])0x0;
        local_d88 = (undefined1  [16])0x0;
        local_d78 = (undefined1  [16])0x0;
        local_d68 = (undefined1  [16])0x0;
        local_d58 = (undefined1  [16])0x0;
        local_d48 = (undefined1  [16])0x0;
        local_d38[0] = 0;
        local_d38[1] = 0;
        stack0xfffffffffffff2d0 = 0;
        uStack_d2b = 0;
        iStack_d28 = 0;
        bStack_d24 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_d98,local_e48);
        if (((*(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) == 2) ||
            ((fpclass_type)local_d20 == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)&pnVar11[-1].m_backend.data + lVar26),
                                (cpp_dec_float<200U,_int,_void> *)local_d98), -1 < iVar10)) {
          pnVar11 = (local_da8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_d20._0_4_ = cpp_dec_float_finite;
          local_d20._4_4_ = 0x1c;
          local_d98 = ZEXT816(0);
          local_d88 = ZEXT816(0);
          local_d78 = ZEXT816(0);
          local_d68 = ZEXT816(0);
          local_d58 = ZEXT816(0);
          local_d48 = ZEXT816(0);
          local_d38[0] = 0;
          local_d38[1] = 0;
          stack0xfffffffffffff2d0 = 0;
          uStack_d2b = 0;
          iStack_d28 = 0;
          bStack_d24 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_d98,local_db8);
          if (((*(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) == 2) ||
              ((fpclass_type)local_d20 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)&pnVar11[-1].m_backend.data + lVar26),
                                  (cpp_dec_float<200U,_int,_void> *)local_d98), iVar10 < 1)) {
            local_c20._0_4_ = cpp_dec_float_finite;
            local_c20._4_4_ = 0x1c;
            bStack_c24 = false;
            iStack_c28 = 0;
            pcVar12 = &local_578;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c98;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_c28 = local_578.exp;
            bStack_c24 = local_578.neg;
            local_c20._0_4_ = local_578.fpclass;
            local_c20._4_4_ = local_578.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_c98,
                       (cpp_dec_float<200U,_int,_void> *)local_b98);
            puVar21 = (uint *)local_ec8;
            pcVar12 = &local_d18;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_d18.exp = iStack_e58;
            local_d18.neg = bStack_e54;
            local_d18.fpclass = (fpclass_type)local_e50;
            local_d18.prec_elem = local_e50._4_4_;
            if ((bStack_e54 == true) &&
               ((fpclass_type)local_e50 != cpp_dec_float_finite || local_d18.data._M_elems[0] != 0))
            {
              local_d18.neg = false;
            }
            local_d20._0_4_ = cpp_dec_float_finite;
            local_d20._4_4_ = 0x1c;
            bStack_d24 = false;
            iStack_d28 = 0;
            puVar21 = (uint *)local_c98;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d98;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            }
            iStack_d28 = iStack_c28;
            bStack_d24 = bStack_c24;
            local_d20._0_4_ = (fpclass_type)local_c20;
            local_d20._4_4_ = local_c20._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_d98,&local_d18);
            goto LAB_005a0915;
          }
          local_d18.fpclass = cpp_dec_float_finite;
          local_d18.prec_elem = 0x1c;
          local_d18.neg = false;
          local_d18.exp = 0;
          pcVar12 = &local_678;
          pcVar19 = &local_d18;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
          }
          local_d18.exp = local_678.exp;
          local_d18.neg = local_678.neg;
          local_d18.fpclass = local_678.fpclass;
          local_d18.prec_elem = local_678.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_a98);
          local_c20._0_4_ = cpp_dec_float_finite;
          local_c20._4_4_ = 0x1c;
          iStack_c28 = 0;
          bStack_c24 = false;
          pcVar12 = &local_d18;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c98;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
          }
          iStack_c28 = local_d18.exp;
          bStack_c24 = local_d18.neg;
          local_c20._0_4_ = local_d18.fpclass;
          local_c20._4_4_ = local_d18.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_c98,
                     (cpp_dec_float<200U,_int,_void> *)local_b98);
          local_d20._0_4_ = cpp_dec_float_finite;
          local_d20._4_4_ = 0x1c;
          iStack_d28 = 0;
          bStack_d24 = false;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c98;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_d98;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
          }
          iStack_d28 = iStack_c28;
          bStack_d24 = bStack_c24;
          local_d20._0_4_ = (fpclass_type)local_c20;
          local_d20._4_4_ = local_c20._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_d98,
                     (cpp_dec_float<200U,_int,_void> *)local_ec8);
          pnVar11 = (this->colWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d98;
          puVar21 = (uint *)((long)&pnVar11[-1].m_backend.data + lVar26);
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
          *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_d28;
          *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_d24;
          *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_d20;
          (this->colUp).data[lVar27 + -2] = false;
        }
        else {
          pnVar11 = (local_da8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar11[-1].m_backend.data + lVar26);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(local_da8->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .up.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
          local_6f8.fpclass = cpp_dec_float_finite;
          local_6f8.prec_elem = 0x1c;
          local_6f8.data._M_elems[0] = 0;
          local_6f8.data._M_elems[1] = 0;
          local_6f8.data._M_elems[2] = 0;
          local_6f8.data._M_elems[3] = 0;
          local_6f8.data._M_elems[4] = 0;
          local_6f8.data._M_elems[5] = 0;
          local_6f8.data._M_elems[6] = 0;
          local_6f8.data._M_elems[7] = 0;
          local_6f8.data._M_elems[8] = 0;
          local_6f8.data._M_elems[9] = 0;
          local_6f8.data._M_elems[10] = 0;
          local_6f8.data._M_elems[0xb] = 0;
          local_6f8.data._M_elems[0xc] = 0;
          local_6f8.data._M_elems[0xd] = 0;
          local_6f8.data._M_elems[0xe] = 0;
          local_6f8.data._M_elems[0xf] = 0;
          local_6f8.data._M_elems[0x10] = 0;
          local_6f8.data._M_elems[0x11] = 0;
          local_6f8.data._M_elems[0x12] = 0;
          local_6f8.data._M_elems[0x13] = 0;
          local_6f8.data._M_elems[0x14] = 0;
          local_6f8.data._M_elems[0x15] = 0;
          local_6f8.data._M_elems[0x16] = 0;
          local_6f8.data._M_elems[0x17] = 0;
          local_6f8.data._M_elems[0x18] = 0;
          local_6f8.data._M_elems[0x19] = 0;
          local_6f8.data._M_elems._104_5_ = 0;
          local_6f8.data._M_elems[0x1b]._1_3_ = 0;
          local_6f8.exp = 0;
          local_6f8.neg = false;
          if (pcVar19 == &local_6f8) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_6f8,pcVar12);
            if (local_6f8.data._M_elems[0] != 0 || local_6f8.fpclass != cpp_dec_float_finite) {
              local_6f8.neg = (bool)(local_6f8.neg ^ 1);
            }
          }
          else {
            if (pcVar12 != &local_6f8) {
              pcVar20 = &local_6f8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_6f8.exp = *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70);
              local_6f8.neg = *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74);
              local_6f8._120_8_ = *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78)
              ;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_6f8,pcVar19);
          }
          local_d20._0_4_ = cpp_dec_float_finite;
          local_d20._4_4_ = 0x1c;
          bStack_d24 = false;
          iStack_d28 = 0;
          pcVar12 = &local_6f8;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_d98;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
          }
          iStack_d28 = local_6f8.exp;
          bStack_d24 = local_6f8.neg;
          local_d20._0_4_ = local_6f8.fpclass;
          local_d20._4_4_ = local_6f8.prec_elem;
          if ((local_6f8.neg == true) &&
             (local_d98._0_4_ != 0 || local_6f8.fpclass != cpp_dec_float_finite)) {
            bStack_d24 = false;
          }
          if (((local_6f8.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_200 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_d98,
                                  (cpp_dec_float<200U,_int,_void> *)local_278), -1 < iVar10)) {
            pnVar11 = (local_da8->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_d20._0_4_ = cpp_dec_float_finite;
            local_d20._4_4_ = 0x1c;
            local_d98 = (undefined1  [16])0x0;
            local_d88 = (undefined1  [16])0x0;
            local_d78 = (undefined1  [16])0x0;
            local_d68 = (undefined1  [16])0x0;
            local_d58 = (undefined1  [16])0x0;
            local_d48 = (undefined1  [16])0x0;
            local_d38[0] = 0;
            local_d38[1] = 0;
            stack0xfffffffffffff2d0 = 0;
            uStack_d2b = 0;
            iStack_d28 = 0;
            bStack_d24 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_d98,local_db8);
            if ((*(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) != 2) &&
               ((fpclass_type)local_d20 != cpp_dec_float_NaN)) {
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)&pnVar11[-1].m_backend.data + lVar26),
                                  (cpp_dec_float<200U,_int,_void> *)local_d98);
              if (0 < iVar10) {
                local_d18.fpclass = cpp_dec_float_finite;
                local_d18.prec_elem = 0x1c;
                local_d18.neg = false;
                local_d18.exp = 0;
                puVar21 = (uint *)&local_3f8;
                pcVar12 = &local_d18;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar21;
                  puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                }
                local_d18.exp = iStack_388;
                local_d18.neg = (bool)bStack_384;
                local_d18.fpclass = (fpclass_type)local_380;
                local_d18.prec_elem = local_380._4_4_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_a98);
                local_c20._0_4_ = cpp_dec_float_finite;
                local_c20._4_4_ = 0x1c;
                iStack_c28 = 0;
                bStack_c24 = false;
                pcVar12 = &local_d18;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c98;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                }
                iStack_c28 = local_d18.exp;
                bStack_c24 = local_d18.neg;
                local_c20._0_4_ = local_d18.fpclass;
                local_c20._4_4_ = local_d18.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_c98,
                           (cpp_dec_float<200U,_int,_void> *)local_c18);
                local_d20._0_4_ = cpp_dec_float_finite;
                local_d20._4_4_ = 0x1c;
                iStack_d28 = 0;
                bStack_d24 = false;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c98;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_d98;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                }
                iStack_d28 = iStack_c28;
                bStack_d24 = bStack_c24;
                local_d20._0_4_ = (fpclass_type)local_c20;
                local_d20._4_4_ = local_c20._4_4_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_d98,
                           (cpp_dec_float<200U,_int,_void> *)local_b98);
                pnVar11 = (this->colWeight).data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d98;
                puVar21 = (uint *)((long)&pnVar11[-1].m_backend.data + lVar26);
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  *puVar21 = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                  puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
                }
                *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_d28;
                *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_d24;
                *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_d20;
                if (bStack_a24 == true) {
                  bStack_a24 = local_a98._0_4_ == 0 &&
                               (fpclass_type)local_a20 == cpp_dec_float_finite;
                }
                if (bStack_ba4 == true) {
                  bStack_ba4 = local_c18._0_4_ == 0 &&
                               (fpclass_type)local_ba0 == cpp_dec_float_finite;
                }
                if (((fpclass_type)local_a20 == cpp_dec_float_NaN ||
                     (fpclass_type)local_ba0 == cpp_dec_float_NaN) ||
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare((cpp_dec_float<200U,_int,_void> *)local_c18,
                                     (cpp_dec_float<200U,_int,_void> *)local_a98), -1 < iVar10)) {
                  (this->colUp).data[lVar27 + -2] = false;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)&(this->colWeight).data.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                             lVar26),(cpp_dec_float<200U,_int,_void> *)local_ec8);
                }
                else {
                  (this->colUp).data[lVar27 + -2] = true;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)&(this->colWeight).data.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                             lVar26),(cpp_dec_float<200U,_int,_void> *)local_ec8);
                }
                goto LAB_005a0951;
              }
            }
            local_d18.fpclass = cpp_dec_float_finite;
            local_d18.prec_elem = 0x1c;
            local_d18.neg = false;
            local_d18.exp = 0;
            pcVar12 = &local_678;
            pcVar19 = &local_d18;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            local_d18.exp = local_678.exp;
            local_d18.neg = local_678.neg;
            local_d18.fpclass = local_678.fpclass;
            local_d18.prec_elem = local_678.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_c18);
            local_c20._0_4_ = cpp_dec_float_finite;
            local_c20._4_4_ = 0x1c;
            iStack_c28 = 0;
            bStack_c24 = false;
            pcVar12 = &local_d18;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c98;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_c28 = local_d18.exp;
            bStack_c24 = local_d18.neg;
            local_c20._0_4_ = local_d18.fpclass;
            local_c20._4_4_ = local_d18.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_c98,
                       (cpp_dec_float<200U,_int,_void> *)local_ec8);
            local_d20._0_4_ = cpp_dec_float_finite;
            local_d20._4_4_ = 0x1c;
            iStack_d28 = 0;
            bStack_d24 = false;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c98;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_d98;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_d28 = iStack_c28;
            bStack_d24 = bStack_c24;
            local_d20._0_4_ = (fpclass_type)local_c20;
            local_d20._4_4_ = local_c20._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_d98,
                       (cpp_dec_float<200U,_int,_void> *)local_b98);
            pnVar11 = (this->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d98;
            puVar21 = (uint *)((long)&pnVar11[-1].m_backend.data + lVar26);
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar21 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
            }
            *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_d28;
            *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_d24;
            *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_d20;
            (this->colUp).data[lVar27 + -2] = true;
          }
          else {
            local_c20._0_4_ = cpp_dec_float_finite;
            local_c20._4_4_ = 0x1c;
            bStack_c24 = false;
            iStack_c28 = 0;
            pcVar12 = &local_2f8;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c98;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
            }
            iStack_c28 = local_2f8.exp;
            bStack_c24 = local_2f8.neg;
            local_c20._0_4_ = local_2f8.fpclass;
            local_c20._4_4_ = local_2f8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_c98,
                       (cpp_dec_float<200U,_int,_void> *)local_b98);
            puVar21 = (uint *)local_ec8;
            pcVar12 = &local_d18;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_d18.exp = iStack_e58;
            local_d18.neg = bStack_e54;
            local_d18.fpclass = (fpclass_type)local_e50;
            local_d18.prec_elem = local_e50._4_4_;
            if ((bStack_e54 == true) &&
               ((fpclass_type)local_e50 != cpp_dec_float_finite || local_d18.data._M_elems[0] != 0))
            {
              local_d18.neg = false;
            }
            local_d20._0_4_ = cpp_dec_float_finite;
            local_d20._4_4_ = 0x1c;
            bStack_d24 = false;
            iStack_d28 = 0;
            puVar21 = (uint *)local_c98;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d98;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            }
            iStack_d28 = iStack_c28;
            bStack_d24 = bStack_c24;
            local_d20._0_4_ = (fpclass_type)local_c20;
            local_d20._4_4_ = local_c20._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_d98,&local_d18);
LAB_005a0915:
            pnVar11 = (this->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar18 = (undefined4 *)local_d98;
            puVar22 = (undefined4 *)((long)&pnVar11[-1].m_backend.data + lVar26);
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar22 = *puVar18;
              puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
              puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
            }
            *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_d28;
            *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_d24;
            *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_d20;
          }
        }
LAB_005a0951:
        lVar27 = lVar27 + -1;
        lVar26 = lVar26 + -0x80;
      } while (1 < lVar27);
    }
    pSVar9 = local_da8;
    lVar26 = (long)(local_da8->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar26) {
      local_e48 = *(double *)(in_FS_OFFSET + -8);
      uStack_e40 = 0;
      local_db8 = -local_e48;
      uStack_db0 = 0x8000000000000000;
      lVar27 = lVar26 + 1;
      lVar26 = lVar26 << 7;
      do {
        pnVar11 = (pSVar9->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_e50._0_4_ = cpp_dec_float_finite;
        local_e50._4_4_ = 0x1c;
        local_ec8 = (undefined1  [16])0x0;
        local_eb8 = (undefined1  [16])0x0;
        local_ea8 = (undefined1  [16])0x0;
        local_e98 = (undefined1  [16])0x0;
        local_e88 = (undefined1  [16])0x0;
        local_e78 = (undefined1  [16])0x0;
        local_e68[0] = 0;
        local_e68[1] = 0;
        stack0xfffffffffffff1a0 = 0;
        uStack_e5b = 0;
        iStack_e58 = 0;
        bStack_e54 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_ec8,local_e48);
        if (((*(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) == 2) ||
            ((fpclass_type)local_e50 == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)&pnVar11[-1].m_backend.data + lVar26),
                                (cpp_dec_float<200U,_int,_void> *)local_ec8), -1 < iVar10)) {
          pnVar11 = (pSVar9->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_e50._0_4_ = cpp_dec_float_finite;
          local_e50._4_4_ = 0x1c;
          local_ec8 = ZEXT816(0);
          local_eb8 = ZEXT816(0);
          local_ea8 = ZEXT816(0);
          local_e98 = ZEXT816(0);
          local_e88 = ZEXT816(0);
          local_e78 = ZEXT816(0);
          local_e68[0] = 0;
          local_e68[1] = 0;
          stack0xfffffffffffff1a0 = 0;
          uStack_e5b = 0;
          iStack_e58 = 0;
          bStack_e54 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_ec8,local_db8);
          if (((*(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) == 2) ||
              ((fpclass_type)local_e50 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)&pnVar11[-1].m_backend.data + lVar26),
                                  (cpp_dec_float<200U,_int,_void> *)local_ec8), iVar10 < 1)) {
            pnVar11 = (this->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar17 = &local_478;
            puVar18 = (undefined4 *)((long)&pnVar11[-1].m_backend.data + lVar26);
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar18 = *(undefined4 *)puVar17;
              puVar17 = (undefined8 *)((long)puVar17 + (ulong)bVar29 * -8 + 4);
              puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
            }
            *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_408;
            *(byte *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_404;
            uVar14 = local_400;
            goto LAB_005a1478;
          }
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(pSVar9->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .left.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
          local_b20._0_4_ = cpp_dec_float_finite;
          local_b20._4_4_ = 0x1c;
          local_b98 = (undefined1  [16])0x0;
          local_b88 = (undefined1  [16])0x0;
          local_b78 = (undefined1  [16])0x0;
          local_b68 = (undefined1  [16])0x0;
          local_b58 = (undefined1  [16])0x0;
          local_b48 = (undefined1  [16])0x0;
          local_b38[0] = 0;
          local_b38[1] = 0;
          stack0xfffffffffffff4d0 = 0;
          uStack_b2b = 0;
          iStack_b28 = 0;
          bStack_b24 = false;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a08;
          if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_b98) {
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_b98;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
            }
            iStack_b28 = iStack_998;
            bStack_b24 = bStack_994;
            local_b20._0_4_ = (fpclass_type)local_990;
            local_b20._4_4_ = local_990._4_4_;
            pcVar12 = pcVar19;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_b98,pcVar12);
          local_e50._0_4_ = cpp_dec_float_finite;
          local_e50._4_4_ = 0x1c;
          bStack_e54 = false;
          iStack_e58 = 0;
          pcVar12 = &local_5f8;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
          }
          iStack_e58 = local_5f8.exp;
          bStack_e54 = local_5f8.neg;
          local_e50._0_4_ = local_5f8.fpclass;
          local_e50._4_4_ = local_5f8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                     (cpp_dec_float<200U,_int,_void> *)local_b98);
          pnVar11 = (this->rowWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
          puVar21 = (uint *)((long)&pnVar11[-1].m_backend.data + lVar26);
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
          *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_e58;
          *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_e54;
          *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_e50;
          (this->rowRight).data[lVar27 + -2] = false;
        }
        else {
          pnVar11 = (pSVar9->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar11[-1].m_backend.data + lVar26);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(pSVar9->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .right.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
          local_778.fpclass = cpp_dec_float_finite;
          local_778.prec_elem = 0x1c;
          local_778.data._M_elems[0] = 0;
          local_778.data._M_elems[1] = 0;
          local_778.data._M_elems[2] = 0;
          local_778.data._M_elems[3] = 0;
          local_778.data._M_elems[4] = 0;
          local_778.data._M_elems[5] = 0;
          local_778.data._M_elems[6] = 0;
          local_778.data._M_elems[7] = 0;
          local_778.data._M_elems[8] = 0;
          local_778.data._M_elems[9] = 0;
          local_778.data._M_elems[10] = 0;
          local_778.data._M_elems[0xb] = 0;
          local_778.data._M_elems[0xc] = 0;
          local_778.data._M_elems[0xd] = 0;
          local_778.data._M_elems[0xe] = 0;
          local_778.data._M_elems[0xf] = 0;
          local_778.data._M_elems[0x10] = 0;
          local_778.data._M_elems[0x11] = 0;
          local_778.data._M_elems[0x12] = 0;
          local_778.data._M_elems[0x13] = 0;
          local_778.data._M_elems[0x14] = 0;
          local_778.data._M_elems[0x15] = 0;
          local_778.data._M_elems[0x16] = 0;
          local_778.data._M_elems[0x17] = 0;
          local_778.data._M_elems[0x18] = 0;
          local_778.data._M_elems[0x19] = 0;
          local_778.data._M_elems._104_5_ = 0;
          local_778.data._M_elems[0x1b]._1_3_ = 0;
          local_778.exp = 0;
          local_778.neg = false;
          if (pcVar19 == &local_778) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_778,pcVar12);
            if (local_778.data._M_elems[0] != 0 || local_778.fpclass != cpp_dec_float_finite) {
              local_778.neg = (bool)(local_778.neg ^ 1);
            }
          }
          else {
            if (pcVar12 != &local_778) {
              pcVar20 = &local_778;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_778.exp = *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70);
              local_778.neg = *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74);
              local_778._120_8_ = *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78)
              ;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_778,pcVar19);
          }
          local_e50._0_4_ = cpp_dec_float_finite;
          local_e50._4_4_ = 0x1c;
          bStack_e54 = false;
          iStack_e58 = 0;
          pcVar12 = &local_778;
          puVar21 = (uint *)local_ec8;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar21 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          }
          iStack_e58 = local_778.exp;
          bStack_e54 = local_778.neg;
          local_e50._0_4_ = local_778.fpclass;
          local_e50._4_4_ = local_778.prec_elem;
          if ((local_778.neg == true) &&
             (local_ec8._0_4_ != 0 || local_778.fpclass != cpp_dec_float_finite)) {
            bStack_e54 = false;
          }
          if (((local_778.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_200 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                                  (cpp_dec_float<200U,_int,_void> *)local_278), -1 < iVar10)) {
            pnVar11 = (pSVar9->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_e50._0_4_ = cpp_dec_float_finite;
            local_e50._4_4_ = 0x1c;
            local_ec8 = (undefined1  [16])0x0;
            local_eb8 = (undefined1  [16])0x0;
            local_ea8 = (undefined1  [16])0x0;
            local_e98 = (undefined1  [16])0x0;
            local_e88 = (undefined1  [16])0x0;
            local_e78 = (undefined1  [16])0x0;
            local_e68[0] = 0;
            local_e68[1] = 0;
            stack0xfffffffffffff1a0 = 0;
            uStack_e5b = 0;
            iStack_e58 = 0;
            bStack_e54 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_ec8,local_db8);
            if (((*(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) == 2) ||
                ((fpclass_type)local_e50 == cpp_dec_float_NaN)) ||
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)
                                    ((long)&pnVar11[-1].m_backend.data + lVar26),
                                    (cpp_dec_float<200U,_int,_void> *)local_ec8), iVar10 < 1)) {
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)&(pSVar9->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .right.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                        lVar26);
              local_b20._0_4_ = cpp_dec_float_finite;
              local_b20._4_4_ = 0x1c;
              local_b98 = (undefined1  [16])0x0;
              local_b88 = (undefined1  [16])0x0;
              local_b78 = (undefined1  [16])0x0;
              local_b68 = (undefined1  [16])0x0;
              local_b58 = (undefined1  [16])0x0;
              local_b48 = (undefined1  [16])0x0;
              local_b38[0] = 0;
              local_b38[1] = 0;
              stack0xfffffffffffff4d0 = 0;
              uStack_b2b = 0;
              iStack_b28 = 0;
              bStack_b24 = false;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a08;
              if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_b98) {
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_b98;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar20 + (ulong)bVar29 * -8 + 4);
                }
                iStack_b28 = iStack_998;
                bStack_b24 = bStack_994;
                local_b20._0_4_ = (fpclass_type)local_990;
                local_b20._4_4_ = local_990._4_4_;
                pcVar12 = pcVar19;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_b98,pcVar12);
              local_e50._0_4_ = cpp_dec_float_finite;
              local_e50._4_4_ = 0x1c;
              iStack_e58 = 0;
              bStack_e54 = false;
              pcVar12 = &local_5f8;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              iStack_e58 = local_5f8.exp;
              bStack_e54 = local_5f8.neg;
              local_e50._0_4_ = local_5f8.fpclass;
              local_e50._4_4_ = local_5f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                         (cpp_dec_float<200U,_int,_void> *)local_b98);
              pnVar11 = (this->rowWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
              puVar21 = (uint *)((long)&pnVar11[-1].m_backend.data + lVar26);
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar21 = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              }
              *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_e58;
              *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_e54;
              *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_e50;
              (this->rowRight).data[lVar27 + -2] = true;
            }
            else {
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)&(pSVar9->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .right.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                        lVar26);
              local_e50._0_4_ = cpp_dec_float_finite;
              local_e50._4_4_ = 0x1c;
              local_ec8 = (undefined1  [16])0x0;
              local_eb8 = (undefined1  [16])0x0;
              local_ea8 = (undefined1  [16])0x0;
              local_e98 = (undefined1  [16])0x0;
              local_e88 = (undefined1  [16])0x0;
              local_e78 = (undefined1  [16])0x0;
              local_e68[0] = 0;
              local_e68[1] = 0;
              stack0xfffffffffffff1a0 = 0;
              uStack_e5b = 0;
              iStack_e58 = 0;
              bStack_e54 = false;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a08;
              if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_ec8) {
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar20 + (ulong)bVar29 * -8 + 4);
                }
                iStack_e58 = iStack_998;
                bStack_e54 = bStack_994;
                local_e50._0_4_ = (fpclass_type)local_990;
                local_e50._4_4_ = local_990._4_4_;
                pcVar12 = pcVar19;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_ec8,pcVar12);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)&(pSVar9->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .left.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                        lVar26);
              local_b20._0_4_ = cpp_dec_float_finite;
              local_b20._4_4_ = 0x1c;
              local_b98 = (undefined1  [16])0x0;
              local_b88 = (undefined1  [16])0x0;
              local_b78 = (undefined1  [16])0x0;
              local_b68 = (undefined1  [16])0x0;
              local_b58 = (undefined1  [16])0x0;
              local_b48 = (undefined1  [16])0x0;
              local_b38[0] = 0;
              local_b38[1] = 0;
              stack0xfffffffffffff4d0 = 0;
              uStack_b2b = 0;
              iStack_b28 = 0;
              bStack_b24 = false;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a08;
              if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_b98) {
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_b98;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar29 * -8 + 4);
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar20 + (ulong)bVar29 * -8 + 4);
                }
                iStack_b28 = iStack_998;
                bStack_b24 = bStack_994;
                local_b20._0_4_ = (fpclass_type)local_990;
                local_b20._4_4_ = local_990._4_4_;
                pcVar12 = pcVar19;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_b98,pcVar12);
              local_a20._0_4_ = cpp_dec_float_finite;
              local_a20._4_4_ = 0x1c;
              bStack_a24 = false;
              iStack_a28 = 0;
              pcVar12 = &local_4f8;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_a98;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar12 + ((ulong)bVar29 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              iStack_a28 = local_4f8.exp;
              bStack_a24 = local_4f8.neg;
              local_a20._0_4_ = local_4f8.fpclass;
              local_a20._4_4_ = local_4f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_a98,
                         (cpp_dec_float<200U,_int,_void> *)local_b98);
              local_ba0._0_4_ = cpp_dec_float_finite;
              local_ba0._4_4_ = 0x1c;
              iStack_ba8 = 0;
              bStack_ba4 = false;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a98;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c18;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              iStack_ba8 = iStack_a28;
              bStack_ba4 = bStack_a24;
              local_ba0._0_4_ = (fpclass_type)local_a20;
              local_ba0._4_4_ = local_a20._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_c18,
                         (cpp_dec_float<200U,_int,_void> *)local_ec8);
              pnVar11 = (this->rowWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c18;
              puVar21 = (uint *)((long)&pnVar11[-1].m_backend.data + lVar26);
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar21 = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              }
              *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = iStack_ba8;
              *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = bStack_ba4;
              *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = local_ba0;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ec8;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_c18;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              iStack_ba8 = iStack_e58;
              bStack_ba4 = bStack_e54;
              local_ba0._0_4_ = (fpclass_type)local_e50;
              local_ba0._4_4_ = local_e50._4_4_;
              if ((bStack_e54 == true) &&
                 (local_c18._0_4_ != 0 || (fpclass_type)local_e50 != cpp_dec_float_finite)) {
                bStack_ba4 = false;
              }
              puVar18 = (undefined4 *)local_b98;
              puVar22 = (undefined4 *)local_a98;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar22 = *puVar18;
                puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
                puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
              }
              iStack_a28 = iStack_b28;
              bStack_a24 = bStack_b24;
              local_a20._0_4_ = (fpclass_type)local_b20;
              local_a20._4_4_ = local_b20._4_4_;
              if ((bStack_b24 == true) &&
                 (local_a98._0_4_ != 0 || (fpclass_type)local_b20 != cpp_dec_float_finite)) {
                bStack_a24 = false;
              }
              if ((fpclass_type)local_b20 == cpp_dec_float_NaN ||
                  (fpclass_type)local_e50 == cpp_dec_float_NaN) {
                bVar28 = false;
              }
              else {
                iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_c18,
                                    (cpp_dec_float<200U,_int,_void> *)local_a98);
                bVar28 = SUB41((uint)iVar10 >> 0x1f,0);
              }
              (this->rowRight).data[lVar27 + -2] = bVar28;
            }
          }
          else {
            pnVar11 = (this->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = &local_378;
            puVar21 = (uint *)((long)&pnVar11[-1].m_backend.data + lVar26);
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar21 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar29 * -8 + 4);
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
            }
            *(int *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x70) = local_378.exp;
            *(bool *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x74) = local_378.neg;
            uVar14 = local_378._120_8_;
LAB_005a1478:
            *(undefined8 *)((long)&pnVar11[-1].m_backend.data + lVar26 + 0x78) = uVar14;
          }
        }
        lVar27 = lVar27 + -1;
        lVar26 = lVar26 + -0x80;
      } while (1 < lVar27);
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}